

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  BBox1f BVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  uint uVar71;
  long lVar72;
  ulong uVar73;
  byte bVar74;
  undefined4 uVar75;
  undefined8 unaff_RBP;
  long lVar76;
  bool bVar77;
  bool bVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar117;
  vint4 bi;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar118;
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar95 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar119;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  vint4 bi_1;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar130 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 bi_2;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  float fVar202;
  float fVar203;
  vint4 ai;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar204;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar205;
  undefined1 auVar201 [32];
  float fVar206;
  float fVar207;
  float fVar225;
  float fVar227;
  vint4 ai_1;
  float fVar230;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar231;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar232;
  float fVar244;
  float fVar245;
  vint4 ai_2;
  float fVar246;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar247;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar248;
  float fVar249;
  float fVar263;
  float fVar264;
  undefined1 auVar250 [16];
  float fVar265;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  vfloat4 b0;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  float fVar276;
  float fVar294;
  float fVar295;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar296;
  float fVar297;
  undefined1 auVar293 [32];
  float fVar298;
  float fVar306;
  float fVar307;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar304 [32];
  float fVar308;
  undefined1 auVar305 [32];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  float fVar330;
  float fVar339;
  float fVar340;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar341;
  undefined1 auVar338 [16];
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  float fVar350;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar357 [64];
  float fVar364;
  vfloat4 a0;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [64];
  vfloat_impl<4> p00;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_448 [16];
  undefined1 (*local_438) [16];
  Primitive *local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  vfloat_impl<4> p03;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  BBox1f cu_stack [4];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar262 [32];
  undefined1 auVar356 [32];
  
  PVar6 = prim[1];
  uVar70 = (ulong)(byte)PVar6;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar284 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  lVar72 = uVar70 * 0x25;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x11 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar163 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar163 = vinsertps_avx(auVar163,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar212 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar212 = vinsertps_avx(auVar212,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar232 = *(float *)(prim + lVar72 + 0x12);
  auVar163 = vsubps_avx(auVar163,*(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar182._0_4_ = fVar232 * auVar163._0_4_;
  auVar182._4_4_ = fVar232 * auVar163._4_4_;
  auVar182._8_4_ = fVar232 * auVar163._8_4_;
  auVar182._12_4_ = fVar232 * auVar163._12_4_;
  auVar323._0_4_ = fVar232 * auVar212._0_4_;
  auVar323._4_4_ = fVar232 * auVar212._4_4_;
  auVar323._8_4_ = fVar232 * auVar212._8_4_;
  auVar323._12_4_ = fVar232 * auVar212._12_4_;
  auVar162 = vcvtdq2ps_avx(auVar284);
  auVar14 = vcvtdq2ps_avx(auVar16);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar212 = vshufps_avx(auVar323,auVar323,0x55);
  auVar284 = vshufps_avx(auVar323,auVar323,0xaa);
  fVar206 = auVar284._0_4_;
  fVar225 = auVar284._4_4_;
  fVar227 = auVar284._8_4_;
  fVar230 = auVar284._12_4_;
  fVar245 = auVar212._0_4_;
  fVar264 = auVar212._4_4_;
  fVar246 = auVar212._8_4_;
  fVar265 = auVar212._12_4_;
  auVar269 = vcvtdq2ps_avx(auVar15);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar83 = vcvtdq2ps_avx(auVar163);
  auVar163 = vshufps_avx(auVar323,auVar323,0);
  fVar232 = auVar163._0_4_;
  fVar248 = auVar163._4_4_;
  fVar244 = auVar163._8_4_;
  fVar263 = auVar163._12_4_;
  auVar331._0_4_ = fVar245 * auVar162._0_4_ + fVar206 * auVar14._0_4_ + fVar232 * auVar269._0_4_;
  auVar331._4_4_ = fVar264 * auVar162._4_4_ + fVar225 * auVar14._4_4_ + fVar248 * auVar269._4_4_;
  auVar331._8_4_ = fVar246 * auVar162._8_4_ + fVar227 * auVar14._8_4_ + fVar244 * auVar269._8_4_;
  auVar331._12_4_ = fVar265 * auVar162._12_4_ + fVar230 * auVar14._12_4_ + fVar263 * auVar269._12_4_
  ;
  auVar358._0_4_ = fVar232 * auVar17._0_4_ + fVar206 * auVar19._0_4_ + fVar245 * auVar18._0_4_;
  auVar358._4_4_ = fVar248 * auVar17._4_4_ + fVar225 * auVar19._4_4_ + fVar264 * auVar18._4_4_;
  auVar358._8_4_ = fVar244 * auVar17._8_4_ + fVar227 * auVar19._8_4_ + fVar246 * auVar18._8_4_;
  auVar358._12_4_ = fVar263 * auVar17._12_4_ + fVar230 * auVar19._12_4_ + fVar265 * auVar18._12_4_;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar124 = vpmovsxwd_avx(auVar163);
  auVar163 = vcvtdq2ps_avx(auVar84);
  auVar168._0_4_ = fVar232 * auVar163._0_4_ + fVar245 * auVar20._0_4_ + fVar206 * auVar83._0_4_;
  auVar168._4_4_ = fVar248 * auVar163._4_4_ + fVar264 * auVar20._4_4_ + fVar225 * auVar83._4_4_;
  auVar168._8_4_ = fVar244 * auVar163._8_4_ + fVar246 * auVar20._8_4_ + fVar227 * auVar83._8_4_;
  auVar168._12_4_ = fVar263 * auVar163._12_4_ + fVar265 * auVar20._12_4_ + fVar230 * auVar83._12_4_;
  auVar212 = vshufps_avx(auVar182,auVar182,0xaa);
  fVar232 = auVar212._0_4_;
  fVar263 = auVar212._4_4_;
  fVar246 = auVar212._8_4_;
  fVar225 = auVar212._12_4_;
  auVar212 = vshufps_avx(auVar182,auVar182,0x55);
  fVar248 = auVar212._0_4_;
  fVar245 = auVar212._4_4_;
  fVar265 = auVar212._8_4_;
  fVar227 = auVar212._12_4_;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar84 = vpmovsxwd_avx(auVar212);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar155 = vpmovsxwd_avx(auVar15);
  auVar284._8_8_ = 0;
  auVar284._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar284 = vpmovsxwd_avx(auVar284);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar212 = vshufps_avx(auVar182,auVar182,0);
  fVar244 = auVar212._0_4_;
  fVar264 = auVar212._4_4_;
  fVar206 = auVar212._8_4_;
  fVar230 = auVar212._12_4_;
  auVar82._0_4_ = auVar269._0_4_ * fVar244 + auVar162._0_4_ * fVar248 + auVar14._0_4_ * fVar232;
  auVar82._4_4_ = auVar269._4_4_ * fVar264 + auVar162._4_4_ * fVar245 + auVar14._4_4_ * fVar263;
  auVar82._8_4_ = auVar269._8_4_ * fVar206 + auVar162._8_4_ * fVar265 + auVar14._8_4_ * fVar246;
  auVar82._12_4_ = auVar269._12_4_ * fVar230 + auVar162._12_4_ * fVar227 + auVar14._12_4_ * fVar225;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar70 * 0x16 + 6);
  auVar162 = vpmovsxwd_avx(auVar162);
  auVar123._0_4_ = fVar244 * auVar17._0_4_ + fVar248 * auVar18._0_4_ + auVar19._0_4_ * fVar232;
  auVar123._4_4_ = fVar264 * auVar17._4_4_ + fVar245 * auVar18._4_4_ + auVar19._4_4_ * fVar263;
  auVar123._8_4_ = fVar206 * auVar17._8_4_ + fVar265 * auVar18._8_4_ + auVar19._8_4_ * fVar246;
  auVar123._12_4_ = fVar230 * auVar17._12_4_ + fVar227 * auVar18._12_4_ + auVar19._12_4_ * fVar225;
  auVar154._0_4_ = auVar163._0_4_ * fVar244 + fVar248 * auVar20._0_4_ + fVar232 * auVar83._0_4_;
  auVar154._4_4_ = auVar163._4_4_ * fVar264 + fVar245 * auVar20._4_4_ + fVar263 * auVar83._4_4_;
  auVar154._8_4_ = auVar163._8_4_ * fVar206 + fVar265 * auVar20._8_4_ + fVar246 * auVar83._8_4_;
  auVar154._12_4_ = auVar163._12_4_ * fVar230 + fVar227 * auVar20._12_4_ + fVar225 * auVar83._12_4_;
  auVar266._8_4_ = 0x7fffffff;
  auVar266._0_8_ = 0x7fffffff7fffffff;
  auVar266._12_4_ = 0x7fffffff;
  auVar163 = vandps_avx(auVar331,auVar266);
  auVar144._8_4_ = 0x219392ef;
  auVar144._0_8_ = 0x219392ef219392ef;
  auVar144._12_4_ = 0x219392ef;
  auVar163 = vcmpps_avx(auVar163,auVar144,1);
  auVar212 = vblendvps_avx(auVar331,auVar144,auVar163);
  auVar163 = vandps_avx(auVar358,auVar266);
  auVar163 = vcmpps_avx(auVar163,auVar144,1);
  auVar15 = vblendvps_avx(auVar358,auVar144,auVar163);
  auVar163 = vandps_avx(auVar168,auVar266);
  auVar163 = vcmpps_avx(auVar163,auVar144,1);
  auVar163 = vblendvps_avx(auVar168,auVar144,auVar163);
  auVar14 = vrcpps_avx(auVar212);
  fVar206 = auVar14._0_4_;
  auVar188._0_4_ = fVar206 * auVar212._0_4_;
  fVar225 = auVar14._4_4_;
  auVar188._4_4_ = fVar225 * auVar212._4_4_;
  fVar227 = auVar14._8_4_;
  auVar188._8_4_ = fVar227 * auVar212._8_4_;
  fVar230 = auVar14._12_4_;
  auVar188._12_4_ = fVar230 * auVar212._12_4_;
  auVar332._8_4_ = 0x3f800000;
  auVar332._0_8_ = 0x3f8000003f800000;
  auVar332._12_4_ = 0x3f800000;
  auVar212 = vsubps_avx(auVar332,auVar188);
  fVar206 = fVar206 + fVar206 * auVar212._0_4_;
  fVar225 = fVar225 + fVar225 * auVar212._4_4_;
  fVar227 = fVar227 + fVar227 * auVar212._8_4_;
  fVar230 = fVar230 + fVar230 * auVar212._12_4_;
  auVar212 = vrcpps_avx(auVar15);
  fVar232 = auVar212._0_4_;
  auVar133._0_4_ = fVar232 * auVar15._0_4_;
  fVar244 = auVar212._4_4_;
  auVar133._4_4_ = fVar244 * auVar15._4_4_;
  fVar245 = auVar212._8_4_;
  auVar133._8_4_ = fVar245 * auVar15._8_4_;
  fVar246 = auVar212._12_4_;
  auVar133._12_4_ = fVar246 * auVar15._12_4_;
  auVar212 = vsubps_avx(auVar332,auVar133);
  fVar232 = fVar232 + fVar232 * auVar212._0_4_;
  fVar244 = fVar244 + fVar244 * auVar212._4_4_;
  fVar245 = fVar245 + fVar245 * auVar212._8_4_;
  fVar246 = fVar246 + fVar246 * auVar212._12_4_;
  auVar212 = vrcpps_avx(auVar163);
  fVar248 = auVar212._0_4_;
  auVar250._0_4_ = fVar248 * auVar163._0_4_;
  fVar263 = auVar212._4_4_;
  auVar250._4_4_ = fVar263 * auVar163._4_4_;
  fVar264 = auVar212._8_4_;
  auVar250._8_4_ = fVar264 * auVar163._8_4_;
  fVar265 = auVar212._12_4_;
  auVar250._12_4_ = fVar265 * auVar163._12_4_;
  auVar163 = vsubps_avx(auVar332,auVar250);
  fVar248 = fVar248 + fVar248 * auVar163._0_4_;
  fVar263 = fVar263 + fVar263 * auVar163._4_4_;
  fVar264 = fVar264 + fVar264 * auVar163._8_4_;
  fVar265 = fVar265 + fVar265 * auVar163._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar70 * 0x14 + 6);
  auVar15 = vpmovsxwd_avx(auVar14);
  auVar14 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar72 + 0x16)) *
                                        *(float *)(prim + lVar72 + 0x1a))),0);
  auVar163 = vcvtdq2ps_avx(auVar124);
  auVar212 = vcvtdq2ps_avx(auVar84);
  auVar212 = vsubps_avx(auVar212,auVar163);
  fVar79 = auVar14._0_4_;
  fVar80 = auVar14._4_4_;
  fVar81 = auVar14._8_4_;
  fVar117 = auVar14._12_4_;
  auVar99._0_4_ = fVar79 * auVar212._0_4_ + auVar163._0_4_;
  auVar99._4_4_ = fVar80 * auVar212._4_4_ + auVar163._4_4_;
  auVar99._8_4_ = fVar81 * auVar212._8_4_ + auVar163._8_4_;
  auVar99._12_4_ = fVar117 * auVar212._12_4_ + auVar163._12_4_;
  auVar163 = vcvtdq2ps_avx(auVar155);
  auVar212 = vcvtdq2ps_avx(auVar284);
  auVar212 = vsubps_avx(auVar212,auVar163);
  auVar267._0_4_ = fVar79 * auVar212._0_4_ + auVar163._0_4_;
  auVar267._4_4_ = fVar80 * auVar212._4_4_ + auVar163._4_4_;
  auVar267._8_4_ = fVar81 * auVar212._8_4_ + auVar163._8_4_;
  auVar267._12_4_ = fVar117 * auVar212._12_4_ + auVar163._12_4_;
  auVar163 = vcvtdq2ps_avx(auVar16);
  auVar212 = vcvtdq2ps_avx(auVar162);
  auVar212 = vsubps_avx(auVar212,auVar163);
  auVar277._0_4_ = fVar79 * auVar212._0_4_ + auVar163._0_4_;
  auVar277._4_4_ = fVar80 * auVar212._4_4_ + auVar163._4_4_;
  auVar277._8_4_ = fVar81 * auVar212._8_4_ + auVar163._8_4_;
  auVar277._12_4_ = fVar117 * auVar212._12_4_ + auVar163._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar212 = vpmovsxwd_avx(auVar18);
  auVar163 = vcvtdq2ps_avx(auVar15);
  auVar212 = vcvtdq2ps_avx(auVar212);
  auVar212 = vsubps_avx(auVar212,auVar163);
  auVar299._0_4_ = fVar79 * auVar212._0_4_ + auVar163._0_4_;
  auVar299._4_4_ = fVar80 * auVar212._4_4_ + auVar163._4_4_;
  auVar299._8_4_ = fVar81 * auVar212._8_4_ + auVar163._8_4_;
  auVar299._12_4_ = fVar117 * auVar212._12_4_ + auVar163._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar163 = vpmovsxwd_avx(auVar19);
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar70 * 0x21 + 6);
  auVar212 = vpmovsxwd_avx(auVar269);
  auVar212 = vcvtdq2ps_avx(auVar212);
  auVar212 = vsubps_avx(auVar212,auVar163);
  auVar312._0_4_ = fVar79 * auVar212._0_4_ + auVar163._0_4_;
  auVar312._4_4_ = fVar80 * auVar212._4_4_ + auVar163._4_4_;
  auVar312._8_4_ = fVar81 * auVar212._8_4_ + auVar163._8_4_;
  auVar312._12_4_ = fVar117 * auVar212._12_4_ + auVar163._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar70 * 0x1f + 6);
  auVar163 = vpmovsxwd_avx(auVar17);
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar212 = vpmovsxwd_avx(auVar20);
  auVar212 = vcvtdq2ps_avx(auVar212);
  auVar212 = vsubps_avx(auVar212,auVar163);
  auVar324._0_4_ = fVar79 * auVar212._0_4_ + auVar163._0_4_;
  auVar324._4_4_ = fVar80 * auVar212._4_4_ + auVar163._4_4_;
  auVar324._8_4_ = fVar81 * auVar212._8_4_ + auVar163._8_4_;
  auVar324._12_4_ = fVar117 * auVar212._12_4_ + auVar163._12_4_;
  auVar163 = vsubps_avx(auVar99,auVar82);
  auVar189._0_4_ = fVar206 * auVar163._0_4_;
  auVar189._4_4_ = fVar225 * auVar163._4_4_;
  auVar189._8_4_ = fVar227 * auVar163._8_4_;
  auVar189._12_4_ = fVar230 * auVar163._12_4_;
  auVar163 = vsubps_avx(auVar267,auVar82);
  auVar83._0_4_ = fVar206 * auVar163._0_4_;
  auVar83._4_4_ = fVar225 * auVar163._4_4_;
  auVar83._8_4_ = fVar227 * auVar163._8_4_;
  auVar83._12_4_ = fVar230 * auVar163._12_4_;
  auVar163 = vsubps_avx(auVar277,auVar123);
  auVar132._0_4_ = fVar232 * auVar163._0_4_;
  auVar132._4_4_ = fVar244 * auVar163._4_4_;
  auVar132._8_4_ = fVar245 * auVar163._8_4_;
  auVar132._12_4_ = fVar246 * auVar163._12_4_;
  auVar163 = vsubps_avx(auVar299,auVar123);
  auVar124._0_4_ = fVar232 * auVar163._0_4_;
  auVar124._4_4_ = fVar244 * auVar163._4_4_;
  auVar124._8_4_ = fVar245 * auVar163._8_4_;
  auVar124._12_4_ = fVar246 * auVar163._12_4_;
  auVar163 = vsubps_avx(auVar312,auVar154);
  auVar233._0_4_ = fVar248 * auVar163._0_4_;
  auVar233._4_4_ = fVar263 * auVar163._4_4_;
  auVar233._8_4_ = fVar264 * auVar163._8_4_;
  auVar233._12_4_ = fVar265 * auVar163._12_4_;
  auVar163 = vsubps_avx(auVar324,auVar154);
  auVar155._0_4_ = fVar248 * auVar163._0_4_;
  auVar155._4_4_ = fVar263 * auVar163._4_4_;
  auVar155._8_4_ = fVar264 * auVar163._8_4_;
  auVar155._12_4_ = fVar265 * auVar163._12_4_;
  auVar163 = vpminsd_avx(auVar189,auVar83);
  auVar212 = vpminsd_avx(auVar132,auVar124);
  auVar163 = vmaxps_avx(auVar163,auVar212);
  auVar212 = vpminsd_avx(auVar233,auVar155);
  uVar75 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar278._4_4_ = uVar75;
  auVar278._0_4_ = uVar75;
  auVar278._8_4_ = uVar75;
  auVar278._12_4_ = uVar75;
  auVar212 = vmaxps_avx(auVar212,auVar278);
  auVar163 = vmaxps_avx(auVar163,auVar212);
  auVar251._0_4_ = auVar163._0_4_ * 0.99999964;
  auVar251._4_4_ = auVar163._4_4_ * 0.99999964;
  auVar251._8_4_ = auVar163._8_4_ * 0.99999964;
  auVar251._12_4_ = auVar163._12_4_ * 0.99999964;
  auVar163 = vpmaxsd_avx(auVar189,auVar83);
  auVar212 = vpmaxsd_avx(auVar132,auVar124);
  auVar163 = vminps_avx(auVar163,auVar212);
  auVar212 = vpmaxsd_avx(auVar233,auVar155);
  uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar156._4_4_ = uVar75;
  auVar156._0_4_ = uVar75;
  auVar156._8_4_ = uVar75;
  auVar156._12_4_ = uVar75;
  auVar212 = vminps_avx(auVar212,auVar156);
  auVar163 = vminps_avx(auVar163,auVar212);
  auVar212 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar212 = vpcmpgtd_avx(auVar212,_DAT_01f4ad30);
  auVar84._0_4_ = auVar163._0_4_ * 1.0000004;
  auVar84._4_4_ = auVar163._4_4_ * 1.0000004;
  auVar84._8_4_ = auVar163._8_4_ * 1.0000004;
  auVar84._12_4_ = auVar163._12_4_ * 1.0000004;
  auVar163 = vcmpps_avx(auVar251,auVar84,2);
  auVar163 = vandps_avx(auVar163,auVar212);
  uVar75 = vmovmskps_avx(auVar163);
  uVar70 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar75);
  auVar111._16_16_ = mm_lookupmask_ps._240_16_;
  auVar111._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar58 = ZEXT412(0);
  local_430 = prim;
LAB_0094a9a3:
  auVar60._12_4_ = 0;
  auVar60._0_12_ = auVar58;
  if (uVar70 == 0) {
LAB_0094cc71:
    return uVar70 != 0;
  }
  lVar72 = 0;
  if (uVar70 != 0) {
    for (; (uVar70 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  uVar69 = *(uint *)(local_430 + 2);
  pGVar7 = (context->scene->geometries).items[uVar69].ptr;
  fVar232 = (pGVar7->time_range).lower;
  fVar232 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar232) / ((pGVar7->time_range).upper - fVar232));
  auVar163 = vroundss_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar232),9);
  auVar163 = vminss_avx(auVar163,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar163 = vmaxss_avx(auVar60 << 0x20,auVar163);
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(local_430 + lVar72 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar76 = (long)(int)auVar163._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar76);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar76);
  pfVar4 = (float *)(lVar9 + lVar10 * uVar73);
  fVar248 = *pfVar4;
  fVar244 = pfVar4[1];
  fVar263 = pfVar4[2];
  fVar245 = pfVar4[3];
  lVar1 = uVar73 + 1;
  pfVar4 = (float *)(lVar9 + lVar10 * lVar1);
  fVar264 = *pfVar4;
  fVar246 = pfVar4[1];
  fVar265 = pfVar4[2];
  fVar206 = pfVar4[3];
  lVar2 = uVar73 + 2;
  pfVar4 = (float *)(lVar9 + lVar10 * lVar2);
  fVar225 = *pfVar4;
  fVar227 = pfVar4[1];
  fVar230 = pfVar4[2];
  fVar79 = pfVar4[3];
  lVar3 = uVar73 + 3;
  pfVar4 = (float *)(lVar9 + lVar10 * lVar3);
  fVar80 = *pfVar4;
  fVar81 = pfVar4[1];
  fVar117 = pfVar4[2];
  fVar118 = pfVar4[3];
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar76);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar76);
  pfVar4 = (float *)(lVar10 + lVar11 * uVar73);
  fVar187 = *pfVar4;
  fVar202 = pfVar4[1];
  fVar203 = pfVar4[2];
  fVar204 = pfVar4[3];
  pfVar4 = (float *)(lVar10 + lVar11 * lVar1);
  fVar207 = *pfVar4;
  fVar226 = pfVar4[1];
  fVar228 = pfVar4[2];
  fVar231 = pfVar4[3];
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar119 = *pfVar4;
  fVar120 = pfVar4[1];
  fVar121 = pfVar4[2];
  fVar122 = pfVar4[3];
  fVar232 = fVar232 - auVar163._0_4_;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar3);
  fVar205 = *pfVar4;
  fVar247 = pfVar4[1];
  fVar229 = pfVar4[2];
  fVar276 = pfVar4[3];
  auVar85._0_4_ = fVar264 * 0.0 + fVar225 * 0.5 + fVar80 * 0.0;
  auVar85._4_4_ = fVar246 * 0.0 + fVar227 * 0.5 + fVar81 * 0.0;
  auVar85._8_4_ = fVar265 * 0.0 + fVar230 * 0.5 + fVar117 * 0.0;
  auVar85._12_4_ = fVar206 * 0.0 + fVar79 * 0.5 + fVar118 * 0.0;
  auVar157._0_4_ = fVar248 * 0.5;
  auVar157._4_4_ = fVar244 * 0.5;
  auVar157._8_4_ = fVar263 * 0.5;
  auVar157._12_4_ = fVar245 * 0.5;
  auVar18 = vsubps_avx(auVar85,auVar157);
  auVar86._0_4_ = fVar207 * 0.0 + fVar119 * 0.5 + fVar205 * 0.0;
  auVar86._4_4_ = fVar226 * 0.0 + fVar120 * 0.5 + fVar247 * 0.0;
  auVar86._8_4_ = fVar228 * 0.0 + fVar121 * 0.5 + fVar229 * 0.0;
  auVar86._12_4_ = fVar231 * 0.0 + fVar122 * 0.5 + fVar276 * 0.0;
  auVar351._0_4_ = fVar187 * 0.5;
  auVar351._4_4_ = fVar202 * 0.5;
  auVar351._8_4_ = fVar203 * 0.5;
  auVar351._12_4_ = fVar204 * 0.5;
  auVar284 = vsubps_avx(auVar86,auVar351);
  local_5a8._0_4_ = fVar248 * -0.0 + fVar225 * 0.0 + fVar80 * -0.0 + fVar264;
  local_5a8._4_4_ = fVar244 * -0.0 + fVar227 * 0.0 + fVar81 * -0.0 + fVar246;
  fStack_5a0 = fVar263 * -0.0 + fVar230 * 0.0 + fVar117 * -0.0 + fVar265;
  fStack_59c = fVar245 * -0.0 + fVar79 * 0.0 + fVar118 * -0.0 + fVar206;
  p00.field_0.v[0] = fVar248 * -0.0 + fVar264 * 0.0 + fVar225 + fVar80 * -0.0;
  p00.field_0.v[1] = fVar244 * -0.0 + fVar246 * 0.0 + fVar227 + fVar81 * -0.0;
  p00.field_0.v[2] = fVar263 * -0.0 + fVar265 * 0.0 + fVar230 + fVar117 * -0.0;
  p00.field_0.v[3] = fVar245 * -0.0 + fVar206 * 0.0 + fVar79 + fVar118 * -0.0;
  auVar279._0_4_ = fVar225 * 0.0 + fVar80 * 0.5;
  auVar279._4_4_ = fVar227 * 0.0 + fVar81 * 0.5;
  auVar279._8_4_ = fVar230 * 0.0 + fVar117 * 0.5;
  auVar279._12_4_ = fVar79 * 0.0 + fVar118 * 0.5;
  auVar208._0_4_ = fVar264 * 0.5;
  auVar208._4_4_ = fVar246 * 0.5;
  auVar208._8_4_ = fVar265 * 0.5;
  auVar208._12_4_ = fVar206 * 0.5;
  auVar163 = vsubps_avx(auVar279,auVar208);
  auVar359._0_4_ = fVar187 * -0.0 + fVar119 * 0.0 + fVar205 * -0.0 + fVar207;
  auVar359._4_4_ = fVar202 * -0.0 + fVar120 * 0.0 + fVar247 * -0.0 + fVar226;
  auVar359._8_4_ = fVar203 * -0.0 + fVar121 * 0.0 + fVar229 * -0.0 + fVar228;
  auVar359._12_4_ = fVar204 * -0.0 + fVar122 * 0.0 + fVar276 * -0.0 + fVar231;
  auVar300._0_4_ = fVar248 * 0.0 + auVar163._0_4_;
  auVar300._4_4_ = fVar244 * 0.0 + auVar163._4_4_;
  auVar300._8_4_ = fVar263 * 0.0 + auVar163._8_4_;
  auVar300._12_4_ = fVar245 * 0.0 + auVar163._12_4_;
  auVar190._0_4_ = fVar187 * -0.0 + fVar207 * 0.0 + fVar119 + fVar205 * -0.0;
  auVar190._4_4_ = fVar202 * -0.0 + fVar226 * 0.0 + fVar120 + fVar247 * -0.0;
  auVar190._8_4_ = fVar203 * -0.0 + fVar228 * 0.0 + fVar121 + fVar229 * -0.0;
  auVar190._12_4_ = fVar204 * -0.0 + fVar231 * 0.0 + fVar122 + fVar276 * -0.0;
  auVar209._0_4_ = fVar119 * 0.0 + fVar205 * 0.5;
  auVar209._4_4_ = fVar120 * 0.0 + fVar247 * 0.5;
  auVar209._8_4_ = fVar121 * 0.0 + fVar229 * 0.5;
  auVar209._12_4_ = fVar122 * 0.0 + fVar276 * 0.5;
  auVar268._0_4_ = fVar207 * 0.5;
  auVar268._4_4_ = fVar226 * 0.5;
  auVar268._8_4_ = fVar228 * 0.5;
  auVar268._12_4_ = fVar231 * 0.5;
  auVar163 = vsubps_avx(auVar209,auVar268);
  auVar210._0_4_ = fVar187 * 0.0 + auVar163._0_4_;
  auVar210._4_4_ = fVar202 * 0.0 + auVar163._4_4_;
  auVar210._8_4_ = fVar203 * 0.0 + auVar163._8_4_;
  auVar210._12_4_ = fVar204 * 0.0 + auVar163._12_4_;
  auVar163 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar212 = vshufps_avx(auVar359,auVar359,0xc9);
  fVar249 = auVar18._0_4_;
  auVar234._0_4_ = fVar249 * auVar212._0_4_;
  fVar294 = auVar18._4_4_;
  auVar234._4_4_ = fVar294 * auVar212._4_4_;
  fVar330 = auVar18._8_4_;
  auVar234._8_4_ = fVar330 * auVar212._8_4_;
  fVar295 = auVar18._12_4_;
  auVar234._12_4_ = fVar295 * auVar212._12_4_;
  auVar280._0_4_ = auVar359._0_4_ * auVar163._0_4_;
  auVar280._4_4_ = auVar359._4_4_ * auVar163._4_4_;
  auVar280._8_4_ = auVar359._8_4_ * auVar163._8_4_;
  auVar280._12_4_ = auVar359._12_4_ * auVar163._12_4_;
  auVar212 = vsubps_avx(auVar280,auVar234);
  auVar15 = vshufps_avx(auVar212,auVar212,0xc9);
  auVar212 = vshufps_avx(auVar284,auVar284,0xc9);
  auVar281._0_4_ = auVar212._0_4_ * fVar249;
  auVar281._4_4_ = auVar212._4_4_ * fVar294;
  auVar281._8_4_ = auVar212._8_4_ * fVar330;
  auVar281._12_4_ = auVar212._12_4_ * fVar295;
  auVar87._0_4_ = auVar163._0_4_ * auVar284._0_4_;
  auVar87._4_4_ = auVar163._4_4_ * auVar284._4_4_;
  auVar87._8_4_ = auVar163._8_4_ * auVar284._8_4_;
  auVar87._12_4_ = auVar163._12_4_ * auVar284._12_4_;
  auVar163 = vsubps_avx(auVar87,auVar281);
  auVar284 = vshufps_avx(auVar163,auVar163,0xc9);
  auVar212 = vshufps_avx(auVar300,auVar300,0xc9);
  auVar163 = vshufps_avx(auVar190,auVar190,0xc9);
  auVar282._0_4_ = auVar300._0_4_ * auVar163._0_4_;
  auVar282._4_4_ = auVar300._4_4_ * auVar163._4_4_;
  auVar282._8_4_ = auVar300._8_4_ * auVar163._8_4_;
  auVar282._12_4_ = auVar300._12_4_ * auVar163._12_4_;
  auVar191._0_4_ = auVar212._0_4_ * auVar190._0_4_;
  auVar191._4_4_ = auVar212._4_4_ * auVar190._4_4_;
  auVar191._8_4_ = auVar212._8_4_ * auVar190._8_4_;
  auVar191._12_4_ = auVar212._12_4_ * auVar190._12_4_;
  auVar163 = vsubps_avx(auVar191,auVar282);
  auVar16 = vshufps_avx(auVar163,auVar163,0xc9);
  auVar163 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar283._0_4_ = auVar300._0_4_ * auVar163._0_4_;
  auVar283._4_4_ = auVar300._4_4_ * auVar163._4_4_;
  auVar283._8_4_ = auVar300._8_4_ * auVar163._8_4_;
  auVar283._12_4_ = auVar300._12_4_ * auVar163._12_4_;
  auVar163 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar211._0_4_ = auVar212._0_4_ * auVar210._0_4_;
  auVar211._4_4_ = auVar212._4_4_ * auVar210._4_4_;
  auVar211._8_4_ = auVar212._8_4_ * auVar210._8_4_;
  auVar211._12_4_ = auVar212._12_4_ * auVar210._12_4_;
  auVar212 = vsubps_avx(auVar211,auVar283);
  auVar162 = vshufps_avx(auVar212,auVar212,0xc9);
  fVar244 = auVar163._0_4_;
  auVar269 = ZEXT416((uint)fVar244);
  auVar212 = vrsqrtss_avx(auVar269,auVar269);
  fVar248 = auVar212._0_4_;
  auVar212 = ZEXT416((uint)(fVar248 * 1.5 - fVar244 * 0.5 * fVar248 * fVar248 * fVar248));
  auVar14 = vshufps_avx(auVar212,auVar212,0);
  auVar212 = vdpps_avx(auVar15,auVar284,0x7f);
  fVar207 = auVar14._0_4_ * auVar15._0_4_;
  fVar226 = auVar14._4_4_ * auVar15._4_4_;
  fVar228 = auVar14._8_4_ * auVar15._8_4_;
  fVar231 = auVar14._12_4_ * auVar15._12_4_;
  auVar163 = vshufps_avx(auVar163,auVar163,0);
  auVar88._0_4_ = auVar163._0_4_ * auVar284._0_4_;
  auVar88._4_4_ = auVar163._4_4_ * auVar284._4_4_;
  auVar88._8_4_ = auVar163._8_4_ * auVar284._8_4_;
  auVar88._12_4_ = auVar163._12_4_ * auVar284._12_4_;
  auVar163 = vshufps_avx(auVar212,auVar212,0);
  auVar235._0_4_ = auVar163._0_4_ * auVar15._0_4_;
  auVar235._4_4_ = auVar163._4_4_ * auVar15._4_4_;
  auVar235._8_4_ = auVar163._8_4_ * auVar15._8_4_;
  auVar235._12_4_ = auVar163._12_4_ * auVar15._12_4_;
  auVar19 = vsubps_avx(auVar88,auVar235);
  auVar163 = vrcpss_avx(auVar269,auVar269);
  auVar163 = ZEXT416((uint)(auVar163._0_4_ * (2.0 - fVar244 * auVar163._0_4_)));
  auVar15 = vshufps_avx(auVar163,auVar163,0);
  auVar163 = vdpps_avx(auVar16,auVar16,0x7f);
  fVar119 = auVar163._0_4_;
  auVar284 = ZEXT416((uint)fVar119);
  auVar212 = vrsqrtss_avx(auVar284,auVar284);
  fVar187 = auVar212._0_4_;
  auVar212 = vdpps_avx(auVar16,auVar162,0x7f);
  auVar163 = vshufps_avx(auVar163,auVar163,0);
  auVar360._0_4_ = auVar162._0_4_ * auVar163._0_4_;
  auVar360._4_4_ = auVar162._4_4_ * auVar163._4_4_;
  auVar360._8_4_ = auVar162._8_4_ * auVar163._8_4_;
  auVar360._12_4_ = auVar162._12_4_ * auVar163._12_4_;
  lVar10 = *(long *)(_Var8 + 0x38 + lVar76);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar76);
  pfVar4 = (float *)(lVar10 + lVar11 * uVar73);
  fVar248 = *pfVar4;
  fVar244 = pfVar4[1];
  fVar263 = pfVar4[2];
  fVar245 = pfVar4[3];
  pfVar4 = (float *)(lVar10 + lVar11 * lVar1);
  fVar264 = *pfVar4;
  fVar246 = pfVar4[1];
  fVar265 = pfVar4[2];
  fVar206 = pfVar4[3];
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar225 = *pfVar4;
  fVar227 = pfVar4[1];
  fVar230 = pfVar4[2];
  fVar79 = pfVar4[3];
  auVar163 = vshufps_avx(auVar212,auVar212,0);
  auVar89._0_4_ = auVar163._0_4_ * auVar16._0_4_;
  auVar89._4_4_ = auVar163._4_4_ * auVar16._4_4_;
  auVar89._8_4_ = auVar163._8_4_ * auVar16._8_4_;
  auVar89._12_4_ = auVar163._12_4_ * auVar16._12_4_;
  auVar162 = vsubps_avx(auVar360,auVar89);
  pfVar4 = (float *)(lVar10 + lVar11 * lVar3);
  fVar80 = *pfVar4;
  fVar81 = pfVar4[1];
  fVar117 = pfVar4[2];
  fVar118 = pfVar4[3];
  lVar10 = *(long *)(lVar9 + 0x38 + lVar76);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar76);
  auVar163 = ZEXT416((uint)(fVar187 * 1.5 - fVar119 * 0.5 * fVar187 * fVar187 * fVar187));
  auVar212 = vshufps_avx(auVar163,auVar163,0);
  fVar187 = auVar212._0_4_ * auVar16._0_4_;
  fVar202 = auVar212._4_4_ * auVar16._4_4_;
  fVar203 = auVar212._8_4_ * auVar16._8_4_;
  fVar204 = auVar212._12_4_ * auVar16._12_4_;
  auVar163 = vrcpss_avx(auVar284,auVar284);
  auVar163 = ZEXT416((uint)(auVar163._0_4_ * (2.0 - auVar163._0_4_ * fVar119)));
  auVar163 = vshufps_avx(auVar163,auVar163,0);
  auVar284 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar333._0_4_ = auVar284._0_4_ * fVar207;
  auVar333._4_4_ = auVar284._4_4_ * fVar226;
  auVar333._8_4_ = auVar284._8_4_ * fVar228;
  auVar333._12_4_ = auVar284._12_4_ * fVar231;
  auVar16 = vshufps_avx(auVar18,auVar18,0xff);
  auVar269 = vsubps_avx(_local_5a8,auVar333);
  auVar270._0_4_ =
       auVar16._0_4_ * fVar207 + auVar284._0_4_ * auVar14._0_4_ * auVar19._0_4_ * auVar15._0_4_;
  auVar270._4_4_ =
       auVar16._4_4_ * fVar226 + auVar284._4_4_ * auVar14._4_4_ * auVar19._4_4_ * auVar15._4_4_;
  auVar270._8_4_ =
       auVar16._8_4_ * fVar228 + auVar284._8_4_ * auVar14._8_4_ * auVar19._8_4_ * auVar15._8_4_;
  auVar270._12_4_ =
       auVar16._12_4_ * fVar231 + auVar284._12_4_ * auVar14._12_4_ * auVar19._12_4_ * auVar15._12_4_
  ;
  auVar18 = vsubps_avx(auVar18,auVar270);
  local_5a8._0_4_ = auVar333._0_4_ + (float)local_5a8._0_4_;
  local_5a8._4_4_ = auVar333._4_4_ + (float)local_5a8._4_4_;
  fStack_5a0 = auVar333._8_4_ + fStack_5a0;
  fStack_59c = auVar333._12_4_ + fStack_59c;
  auVar15 = vshufps_avx((undefined1  [16])p00.field_0,(undefined1  [16])p00.field_0,0xff);
  auVar158._0_4_ = auVar15._0_4_ * fVar187;
  auVar158._4_4_ = auVar15._4_4_ * fVar202;
  auVar158._8_4_ = auVar15._8_4_ * fVar203;
  auVar158._12_4_ = auVar15._12_4_ * fVar204;
  auVar284 = vshufps_avx(auVar300,auVar300,0xff);
  auVar19 = vsubps_avx((undefined1  [16])p00.field_0,auVar158);
  auVar90._0_4_ =
       auVar284._0_4_ * fVar187 + auVar15._0_4_ * auVar212._0_4_ * auVar162._0_4_ * auVar163._0_4_;
  auVar90._4_4_ =
       auVar284._4_4_ * fVar202 + auVar15._4_4_ * auVar212._4_4_ * auVar162._4_4_ * auVar163._4_4_;
  auVar90._8_4_ =
       auVar284._8_4_ * fVar203 + auVar15._8_4_ * auVar212._8_4_ * auVar162._8_4_ * auVar163._8_4_;
  auVar90._12_4_ =
       auVar284._12_4_ * fVar204 +
       auVar15._12_4_ * auVar212._12_4_ * auVar162._12_4_ * auVar163._12_4_;
  auVar17 = vsubps_avx(auVar300,auVar90);
  p00.field_0.v[0] = p00.field_0.v[0] + auVar158._0_4_;
  p00.field_0.v[1] = p00.field_0.v[1] + auVar158._4_4_;
  p00.field_0.v[2] = p00.field_0.v[2] + auVar158._8_4_;
  p00.field_0.v[3] = p00.field_0.v[3] + auVar158._12_4_;
  auVar91._0_4_ = fVar264 * 0.0 + fVar225 * 0.5 + fVar80 * 0.0;
  auVar91._4_4_ = fVar246 * 0.0 + fVar227 * 0.5 + fVar81 * 0.0;
  auVar91._8_4_ = fVar265 * 0.0 + fVar230 * 0.5 + fVar117 * 0.0;
  auVar91._12_4_ = fVar206 * 0.0 + fVar79 * 0.5 + fVar118 * 0.0;
  auVar125._0_4_ = fVar248 * 0.5;
  auVar125._4_4_ = fVar244 * 0.5;
  auVar125._8_4_ = fVar263 * 0.5;
  auVar125._12_4_ = fVar245 * 0.5;
  auVar20 = vsubps_avx(auVar91,auVar125);
  pfVar4 = (float *)(lVar10 + lVar2 * lVar9);
  fVar187 = *pfVar4;
  fVar202 = pfVar4[1];
  fVar203 = pfVar4[2];
  fVar204 = pfVar4[3];
  auVar163 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar3);
  fVar205 = auVar163._0_4_;
  fVar247 = auVar163._4_4_;
  fVar229 = auVar163._8_4_;
  fVar276 = auVar163._12_4_;
  pfVar4 = (float *)(lVar10 + lVar1 * lVar9);
  fVar207 = *pfVar4;
  fVar226 = pfVar4[1];
  fVar228 = pfVar4[2];
  fVar231 = pfVar4[3];
  auVar252._0_4_ = fVar207 * 0.0 + fVar205 * 0.0 + fVar187 * 0.5;
  auVar252._4_4_ = fVar226 * 0.0 + fVar247 * 0.0 + fVar202 * 0.5;
  auVar252._8_4_ = fVar228 * 0.0 + fVar229 * 0.0 + fVar203 * 0.5;
  auVar252._12_4_ = fVar231 * 0.0 + fVar276 * 0.0 + fVar204 * 0.5;
  pfVar4 = (float *)(lVar10 + uVar73 * lVar9);
  fVar119 = *pfVar4;
  fVar120 = pfVar4[1];
  fVar121 = pfVar4[2];
  fVar122 = pfVar4[3];
  auVar285._0_4_ = fVar119 * 0.5;
  auVar285._4_4_ = fVar120 * 0.5;
  auVar285._8_4_ = fVar121 * 0.5;
  auVar285._12_4_ = fVar122 * 0.5;
  auVar212 = vsubps_avx(auVar252,auVar285);
  auVar286._0_4_ = fVar248 * -0.0 + fVar264 + fVar225 * 0.0 + fVar80 * -0.0;
  auVar286._4_4_ = fVar244 * -0.0 + fVar246 + fVar227 * 0.0 + fVar81 * -0.0;
  auVar286._8_4_ = fVar263 * -0.0 + fVar265 + fVar230 * 0.0 + fVar117 * -0.0;
  auVar286._12_4_ = fVar245 * -0.0 + fVar206 + fVar79 * 0.0 + fVar118 * -0.0;
  auVar271._0_4_ = fVar248 * -0.0 + fVar264 * 0.0 + fVar225 + fVar80 * -0.0;
  auVar271._4_4_ = fVar244 * -0.0 + fVar246 * 0.0 + fVar227 + fVar81 * -0.0;
  auVar271._8_4_ = fVar263 * -0.0 + fVar265 * 0.0 + fVar230 + fVar117 * -0.0;
  auVar271._12_4_ = fVar245 * -0.0 + fVar206 * 0.0 + fVar79 + fVar118 * -0.0;
  auVar313._0_4_ = fVar225 * 0.0 + fVar80 * 0.5;
  auVar313._4_4_ = fVar227 * 0.0 + fVar81 * 0.5;
  auVar313._8_4_ = fVar230 * 0.0 + fVar117 * 0.5;
  auVar313._12_4_ = fVar79 * 0.0 + fVar118 * 0.5;
  auVar334._0_4_ = fVar264 * 0.5;
  auVar334._4_4_ = fVar246 * 0.5;
  auVar334._8_4_ = fVar265 * 0.5;
  auVar334._12_4_ = fVar206 * 0.5;
  auVar163 = vsubps_avx(auVar313,auVar334);
  auVar325._0_4_ = fVar248 * 0.0 + auVar163._0_4_;
  auVar325._4_4_ = fVar244 * 0.0 + auVar163._4_4_;
  auVar325._8_4_ = fVar263 * 0.0 + auVar163._8_4_;
  auVar325._12_4_ = fVar245 * 0.0 + auVar163._12_4_;
  auVar314._0_4_ = fVar119 * -0.0 + fVar207 + fVar205 * -0.0 + fVar187 * 0.0;
  auVar314._4_4_ = fVar120 * -0.0 + fVar226 + fVar247 * -0.0 + fVar202 * 0.0;
  auVar314._8_4_ = fVar121 * -0.0 + fVar228 + fVar229 * -0.0 + fVar203 * 0.0;
  auVar314._12_4_ = fVar122 * -0.0 + fVar231 + fVar276 * -0.0 + fVar204 * 0.0;
  auVar126._0_4_ = fVar119 * -0.0 + fVar205 * -0.0 + fVar187 + fVar207 * 0.0;
  auVar126._4_4_ = fVar120 * -0.0 + fVar247 * -0.0 + fVar202 + fVar226 * 0.0;
  auVar126._8_4_ = fVar121 * -0.0 + fVar229 * -0.0 + fVar203 + fVar228 * 0.0;
  auVar126._12_4_ = fVar122 * -0.0 + fVar276 * -0.0 + fVar204 + fVar231 * 0.0;
  auVar159._0_4_ = fVar187 * 0.0 + fVar205 * 0.5;
  auVar159._4_4_ = fVar202 * 0.0 + fVar247 * 0.5;
  auVar159._8_4_ = fVar203 * 0.0 + fVar229 * 0.5;
  auVar159._12_4_ = fVar204 * 0.0 + fVar276 * 0.5;
  auVar192._0_4_ = fVar207 * 0.5;
  auVar192._4_4_ = fVar226 * 0.5;
  auVar192._8_4_ = fVar228 * 0.5;
  auVar192._12_4_ = fVar231 * 0.5;
  auVar163 = vsubps_avx(auVar159,auVar192);
  auVar160._0_4_ = fVar119 * 0.0 + auVar163._0_4_;
  auVar160._4_4_ = fVar120 * 0.0 + auVar163._4_4_;
  auVar160._8_4_ = fVar121 * 0.0 + auVar163._8_4_;
  auVar160._12_4_ = fVar122 * 0.0 + auVar163._12_4_;
  auVar163 = vshufps_avx(auVar314,auVar314,0xc9);
  fVar225 = auVar20._0_4_;
  auVar92._0_4_ = fVar225 * auVar163._0_4_;
  fVar227 = auVar20._4_4_;
  auVar92._4_4_ = fVar227 * auVar163._4_4_;
  fVar230 = auVar20._8_4_;
  auVar92._8_4_ = fVar230 * auVar163._8_4_;
  fVar81 = auVar20._12_4_;
  auVar92._12_4_ = fVar81 * auVar163._12_4_;
  auVar163 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar315._0_4_ = auVar314._0_4_ * auVar163._0_4_;
  auVar315._4_4_ = auVar314._4_4_ * auVar163._4_4_;
  auVar315._8_4_ = auVar314._8_4_ * auVar163._8_4_;
  auVar315._12_4_ = auVar314._12_4_ * auVar163._12_4_;
  auVar15 = vsubps_avx(auVar315,auVar92);
  auVar193._0_4_ = auVar163._0_4_ * auVar212._0_4_;
  auVar193._4_4_ = auVar163._4_4_ * auVar212._4_4_;
  auVar193._8_4_ = auVar163._8_4_ * auVar212._8_4_;
  auVar193._12_4_ = auVar163._12_4_ * auVar212._12_4_;
  auVar163 = vshufps_avx(auVar212,auVar212,0xc9);
  auVar253._0_4_ = fVar225 * auVar163._0_4_;
  auVar253._4_4_ = fVar227 * auVar163._4_4_;
  auVar253._8_4_ = fVar230 * auVar163._8_4_;
  auVar253._12_4_ = fVar81 * auVar163._12_4_;
  auVar284 = vsubps_avx(auVar193,auVar253);
  auVar163 = vshufps_avx(auVar126,auVar126,0xc9);
  auVar254._0_4_ = auVar325._0_4_ * auVar163._0_4_;
  auVar254._4_4_ = auVar325._4_4_ * auVar163._4_4_;
  auVar254._8_4_ = auVar325._8_4_ * auVar163._8_4_;
  auVar254._12_4_ = auVar325._12_4_ * auVar163._12_4_;
  auVar163 = vshufps_avx(auVar325,auVar325,0xc9);
  auVar127._0_4_ = auVar163._0_4_ * auVar126._0_4_;
  auVar127._4_4_ = auVar163._4_4_ * auVar126._4_4_;
  auVar127._8_4_ = auVar163._8_4_ * auVar126._8_4_;
  auVar127._12_4_ = auVar163._12_4_ * auVar126._12_4_;
  auVar16 = vsubps_avx(auVar127,auVar254);
  auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar255._0_4_ = auVar163._0_4_ * auVar160._0_4_;
  auVar255._4_4_ = auVar163._4_4_ * auVar160._4_4_;
  auVar255._8_4_ = auVar163._8_4_ * auVar160._8_4_;
  auVar255._12_4_ = auVar163._12_4_ * auVar160._12_4_;
  auVar163 = vshufps_avx(auVar160,auVar160,0xc9);
  auVar161._0_4_ = auVar325._0_4_ * auVar163._0_4_;
  auVar161._4_4_ = auVar325._4_4_ * auVar163._4_4_;
  auVar161._8_4_ = auVar325._8_4_ * auVar163._8_4_;
  auVar161._12_4_ = auVar325._12_4_ * auVar163._12_4_;
  auVar163 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar14 = vsubps_avx(auVar255,auVar161);
  fVar244 = auVar163._0_4_;
  auVar162 = ZEXT416((uint)fVar244);
  auVar212 = vrsqrtss_avx(auVar162,auVar162);
  fVar248 = auVar212._0_4_;
  auVar212 = vshufps_avx(auVar284,auVar284,0xc9);
  auVar163 = vshufps_avx(auVar163,auVar163,0);
  auVar335._0_4_ = auVar163._0_4_ * auVar212._0_4_;
  auVar335._4_4_ = auVar163._4_4_ * auVar212._4_4_;
  auVar335._8_4_ = auVar163._8_4_ * auVar212._8_4_;
  auVar335._12_4_ = auVar163._12_4_ * auVar212._12_4_;
  auVar163 = vdpps_avx(auVar15,auVar212,0x7f);
  auVar163 = vshufps_avx(auVar163,auVar163,0);
  auVar194._0_4_ = auVar163._0_4_ * auVar15._0_4_;
  auVar194._4_4_ = auVar163._4_4_ * auVar15._4_4_;
  auVar194._8_4_ = auVar163._8_4_ * auVar15._8_4_;
  auVar194._12_4_ = auVar163._12_4_ * auVar15._12_4_;
  auVar83 = vsubps_avx(auVar335,auVar194);
  auVar163 = vrcpss_avx(auVar162,auVar162);
  auVar163 = ZEXT416((uint)((2.0 - fVar244 * auVar163._0_4_) * auVar163._0_4_));
  auVar284 = vshufps_avx(auVar163,auVar163,0);
  auVar16 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar163 = ZEXT416((uint)(fVar248 * 1.5 - fVar244 * 0.5 * fVar248 * fVar248 * fVar248));
  auVar162 = vshufps_avx(auVar163,auVar163,0);
  fVar248 = auVar15._0_4_ * auVar162._0_4_;
  fVar244 = auVar15._4_4_ * auVar162._4_4_;
  fVar263 = auVar15._8_4_ * auVar162._8_4_;
  fVar245 = auVar15._12_4_ * auVar162._12_4_;
  auVar212 = vdpps_avx(auVar16,auVar16,0x7f);
  auVar163 = vblendps_avx(auVar212,_DAT_01f45a50,0xe);
  auVar15 = vrsqrtss_avx(auVar163,auVar163);
  fVar264 = auVar15._0_4_;
  auVar15 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar14 = vshufps_avx(auVar212,auVar212,0);
  auVar346._0_4_ = auVar14._0_4_ * auVar15._0_4_;
  auVar346._4_4_ = auVar14._4_4_ * auVar15._4_4_;
  auVar346._8_4_ = auVar14._8_4_ * auVar15._8_4_;
  auVar346._12_4_ = auVar14._12_4_ * auVar15._12_4_;
  auVar15 = vdpps_avx(auVar16,auVar15,0x7f);
  auVar15 = vshufps_avx(auVar15,auVar15,0);
  auVar336._0_4_ = auVar15._0_4_ * auVar16._0_4_;
  auVar336._4_4_ = auVar15._4_4_ * auVar16._4_4_;
  auVar336._8_4_ = auVar15._8_4_ * auVar16._8_4_;
  auVar336._12_4_ = auVar15._12_4_ * auVar16._12_4_;
  auVar14 = vsubps_avx(auVar346,auVar336);
  auVar163 = vrcpss_avx(auVar163,auVar163);
  auVar163 = ZEXT416((uint)(auVar163._0_4_ * (2.0 - auVar212._0_4_ * auVar163._0_4_)));
  auVar163 = vshufps_avx(auVar163,auVar163,0);
  auVar212 = ZEXT416((uint)(fVar264 * 1.5 - auVar212._0_4_ * 0.5 * fVar264 * fVar264 * fVar264));
  auVar212 = vshufps_avx(auVar212,auVar212,0);
  fVar264 = auVar16._0_4_ * auVar212._0_4_;
  fVar246 = auVar16._4_4_ * auVar212._4_4_;
  fVar265 = auVar16._8_4_ * auVar212._8_4_;
  fVar206 = auVar16._12_4_ * auVar212._12_4_;
  auVar15 = vshufps_avx(auVar20,auVar20,0xff);
  auVar16 = vshufps_avx(auVar286,auVar286,0xff);
  auVar93._0_4_ = auVar16._0_4_ * fVar248;
  auVar93._4_4_ = auVar16._4_4_ * fVar244;
  auVar93._8_4_ = auVar16._8_4_ * fVar263;
  auVar93._12_4_ = auVar16._12_4_ * fVar245;
  auVar128._0_4_ =
       auVar15._0_4_ * fVar248 + auVar16._0_4_ * auVar162._0_4_ * auVar83._0_4_ * auVar284._0_4_;
  auVar128._4_4_ =
       auVar15._4_4_ * fVar244 + auVar16._4_4_ * auVar162._4_4_ * auVar83._4_4_ * auVar284._4_4_;
  auVar128._8_4_ =
       auVar15._8_4_ * fVar263 + auVar16._8_4_ * auVar162._8_4_ * auVar83._8_4_ * auVar284._8_4_;
  auVar128._12_4_ =
       auVar15._12_4_ * fVar245 +
       auVar16._12_4_ * auVar162._12_4_ * auVar83._12_4_ * auVar284._12_4_;
  auVar16 = vsubps_avx(auVar286,auVar93);
  auVar162 = vsubps_avx(auVar20,auVar128);
  auVar15 = vshufps_avx(auVar325,auVar325,0xff);
  auVar284 = vshufps_avx(auVar271,auVar271,0xff);
  auVar195._0_4_ = auVar284._0_4_ * fVar264;
  auVar195._4_4_ = auVar284._4_4_ * fVar246;
  auVar195._8_4_ = auVar284._8_4_ * fVar265;
  auVar195._12_4_ = auVar284._12_4_ * fVar206;
  auVar129._0_4_ =
       auVar15._0_4_ * fVar264 + auVar284._0_4_ * auVar212._0_4_ * auVar14._0_4_ * auVar163._0_4_;
  auVar129._4_4_ =
       auVar15._4_4_ * fVar246 + auVar284._4_4_ * auVar212._4_4_ * auVar14._4_4_ * auVar163._4_4_;
  auVar129._8_4_ =
       auVar15._8_4_ * fVar265 + auVar284._8_4_ * auVar212._8_4_ * auVar14._8_4_ * auVar163._8_4_;
  auVar129._12_4_ =
       auVar15._12_4_ * fVar206 +
       auVar284._12_4_ * auVar212._12_4_ * auVar14._12_4_ * auVar163._12_4_;
  auVar15 = vsubps_avx(auVar271,auVar195);
  auVar347._0_4_ = auVar271._0_4_ + auVar195._0_4_;
  auVar347._4_4_ = auVar271._4_4_ + auVar195._4_4_;
  auVar347._8_4_ = auVar271._8_4_ + auVar195._8_4_;
  auVar347._12_4_ = auVar271._12_4_ + auVar195._12_4_;
  auVar284 = vsubps_avx(auVar325,auVar129);
  local_518 = auVar18._0_4_;
  fStack_514 = auVar18._4_4_;
  fStack_510 = auVar18._8_4_;
  fStack_50c = auVar18._12_4_;
  local_468 = auVar269._0_4_;
  fStack_464 = auVar269._4_4_;
  fStack_460 = auVar269._8_4_;
  fStack_45c = auVar269._12_4_;
  auVar163 = vshufps_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar232),0);
  auVar212 = vshufps_avx(ZEXT416((uint)(1.0 - fVar232)),ZEXT416((uint)(1.0 - fVar232)),0);
  fVar245 = auVar163._0_4_;
  fVar264 = auVar163._4_4_;
  fVar246 = auVar163._8_4_;
  fVar265 = auVar163._12_4_;
  fVar232 = auVar212._0_4_;
  fVar248 = auVar212._4_4_;
  fVar244 = auVar212._8_4_;
  fVar263 = auVar212._12_4_;
  local_3e8._0_4_ = fVar232 * local_468 + fVar245 * auVar16._0_4_;
  local_3e8._4_4_ = fVar248 * fStack_464 + fVar264 * auVar16._4_4_;
  fStack_3e0 = fVar244 * fStack_460 + fVar246 * auVar16._8_4_;
  fStack_3dc = fVar263 * fStack_45c + fVar265 * auVar16._12_4_;
  fVar79 = fVar232 * (local_468 + local_518 * 0.33333334) +
           fVar245 * (auVar16._0_4_ + auVar162._0_4_ * 0.33333334);
  fVar117 = fVar248 * (fStack_464 + fStack_514 * 0.33333334) +
            fVar264 * (auVar16._4_4_ + auVar162._4_4_ * 0.33333334);
  fVar202 = fVar244 * (fStack_460 + fStack_510 * 0.33333334) +
            fVar246 * (auVar16._8_4_ + auVar162._8_4_ * 0.33333334);
  fVar207 = fVar263 * (fStack_45c + fStack_50c * 0.33333334) +
            fVar265 * (auVar16._12_4_ + auVar162._12_4_ * 0.33333334);
  local_588 = auVar17._0_4_;
  fStack_584 = auVar17._4_4_;
  fStack_580 = auVar17._8_4_;
  fStack_57c = auVar17._12_4_;
  auVar196._0_4_ = local_588 * 0.33333334;
  auVar196._4_4_ = fStack_584 * 0.33333334;
  auVar196._8_4_ = fStack_580 * 0.33333334;
  auVar196._12_4_ = fStack_57c * 0.33333334;
  auVar163 = vsubps_avx(auVar19,auVar196);
  auVar256._0_4_ = (auVar300._0_4_ + auVar90._0_4_) * 0.33333334;
  auVar256._4_4_ = (auVar300._4_4_ + auVar90._4_4_) * 0.33333334;
  auVar256._8_4_ = (auVar300._8_4_ + auVar90._8_4_) * 0.33333334;
  auVar256._12_4_ = (auVar300._12_4_ + auVar90._12_4_) * 0.33333334;
  auVar212 = vsubps_avx((undefined1  [16])p00.field_0,auVar256);
  auVar164._0_4_ = auVar284._0_4_ * 0.33333334;
  auVar164._4_4_ = auVar284._4_4_ * 0.33333334;
  auVar164._8_4_ = auVar284._8_4_ * 0.33333334;
  auVar164._12_4_ = auVar284._12_4_ * 0.33333334;
  auVar284 = vsubps_avx(auVar15,auVar164);
  auVar316._0_4_ = (auVar325._0_4_ + auVar129._0_4_) * 0.33333334;
  auVar316._4_4_ = (auVar325._4_4_ + auVar129._4_4_) * 0.33333334;
  auVar316._8_4_ = (auVar325._8_4_ + auVar129._8_4_) * 0.33333334;
  auVar316._12_4_ = (auVar325._12_4_ + auVar129._12_4_) * 0.33333334;
  auVar16 = vsubps_avx(auVar347,auVar316);
  local_3f8._0_4_ = fVar232 * auVar163._0_4_ + fVar245 * auVar284._0_4_;
  local_3f8._4_4_ = fVar248 * auVar163._4_4_ + fVar264 * auVar284._4_4_;
  fStack_3f0 = fVar244 * auVar163._8_4_ + fVar246 * auVar284._8_4_;
  fStack_3ec = fVar263 * auVar163._12_4_ + fVar265 * auVar284._12_4_;
  fVar80 = fVar245 * auVar15._0_4_ + fVar232 * auVar19._0_4_;
  fVar118 = fVar264 * auVar15._4_4_ + fVar248 * auVar19._4_4_;
  fVar203 = fVar246 * auVar15._8_4_ + fVar244 * auVar19._8_4_;
  fVar226 = fVar265 * auVar15._12_4_ + fVar263 * auVar19._12_4_;
  local_408._0_4_ = (float)local_5a8._0_4_ * fVar232 + fVar245 * (auVar286._0_4_ + auVar93._0_4_);
  local_408._4_4_ = (float)local_5a8._4_4_ * fVar248 + fVar264 * (auVar286._4_4_ + auVar93._4_4_);
  fStack_400 = fStack_5a0 * fVar244 + fVar246 * (auVar286._8_4_ + auVar93._8_4_);
  fStack_3fc = fStack_59c * fVar263 + fVar265 * (auVar286._12_4_ + auVar93._12_4_);
  local_418._0_4_ =
       fVar232 * ((float)local_5a8._0_4_ + (fVar249 + auVar270._0_4_) * 0.33333334) +
       fVar245 * (auVar286._0_4_ + auVar93._0_4_ + (fVar225 + auVar128._0_4_) * 0.33333334);
  local_418._4_4_ =
       fVar248 * ((float)local_5a8._4_4_ + (fVar294 + auVar270._4_4_) * 0.33333334) +
       fVar264 * (auVar286._4_4_ + auVar93._4_4_ + (fVar227 + auVar128._4_4_) * 0.33333334);
  fStack_410 = fVar244 * (fStack_5a0 + (fVar330 + auVar270._8_4_) * 0.33333334) +
               fVar246 * (auVar286._8_4_ + auVar93._8_4_ + (fVar230 + auVar128._8_4_) * 0.33333334);
  fStack_40c = fVar263 * (fStack_59c + (fVar295 + auVar270._12_4_) * 0.33333334) +
               fVar265 * (auVar286._12_4_ + auVar93._12_4_ + (fVar81 + auVar128._12_4_) * 0.33333334
                         );
  local_428 = fVar232 * auVar212._0_4_ + fVar245 * auVar16._0_4_;
  fStack_424 = fVar248 * auVar212._4_4_ + fVar264 * auVar16._4_4_;
  fStack_420 = fVar244 * auVar212._8_4_ + fVar246 * auVar16._8_4_;
  fStack_41c = fVar263 * auVar212._12_4_ + fVar265 * auVar16._12_4_;
  fVar81 = p00.field_0.v[0] * fVar232 + fVar245 * auVar347._0_4_;
  fVar187 = p00.field_0.v[1] * fVar248 + fVar264 * auVar347._4_4_;
  fVar204 = p00.field_0.v[2] * fVar244 + fVar246 * auVar347._8_4_;
  fVar228 = p00.field_0.v[3] * fVar263 + fVar265 * auVar347._12_4_;
  auVar163 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar163 = vinsertps_avx(auVar163,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar18 = vsubps_avx(_local_3e8,auVar163);
  auVar15 = vmovsldup_avx(auVar18);
  auVar212 = vmovshdup_avx(auVar18);
  auVar284 = vshufps_avx(auVar18,auVar18,0xaa);
  fVar232 = pre->ray_space[k].vx.field_0.m128[0];
  fVar248 = pre->ray_space[k].vx.field_0.m128[1];
  fVar244 = pre->ray_space[k].vx.field_0.m128[2];
  fVar263 = pre->ray_space[k].vx.field_0.m128[3];
  fVar245 = pre->ray_space[k].vy.field_0.m128[0];
  fVar264 = pre->ray_space[k].vy.field_0.m128[1];
  fVar246 = pre->ray_space[k].vy.field_0.m128[2];
  fVar265 = pre->ray_space[k].vy.field_0.m128[3];
  fVar206 = pre->ray_space[k].vz.field_0.m128[0];
  fVar225 = pre->ray_space[k].vz.field_0.m128[1];
  fVar227 = pre->ray_space[k].vz.field_0.m128[2];
  fVar230 = pre->ray_space[k].vz.field_0.m128[3];
  auVar337._0_4_ = fVar232 * auVar15._0_4_ + fVar245 * auVar212._0_4_ + fVar206 * auVar284._0_4_;
  auVar337._4_4_ = fVar248 * auVar15._4_4_ + fVar264 * auVar212._4_4_ + fVar225 * auVar284._4_4_;
  auVar337._8_4_ = fVar244 * auVar15._8_4_ + fVar246 * auVar212._8_4_ + fVar227 * auVar284._8_4_;
  auVar337._12_4_ = fVar263 * auVar15._12_4_ + fVar265 * auVar212._12_4_ + fVar230 * auVar284._12_4_
  ;
  auVar65._4_4_ = fVar117;
  auVar65._0_4_ = fVar79;
  auVar65._8_4_ = fVar202;
  auVar65._12_4_ = fVar207;
  auVar19 = vsubps_avx(auVar65,auVar163);
  auVar284 = vshufps_avx(auVar19,auVar19,0xaa);
  auVar212 = vmovshdup_avx(auVar19);
  auVar15 = vmovsldup_avx(auVar19);
  auVar348._0_4_ = fVar232 * auVar15._0_4_ + fVar245 * auVar212._0_4_ + fVar206 * auVar284._0_4_;
  auVar348._4_4_ = fVar248 * auVar15._4_4_ + fVar264 * auVar212._4_4_ + fVar225 * auVar284._4_4_;
  auVar348._8_4_ = fVar244 * auVar15._8_4_ + fVar246 * auVar212._8_4_ + fVar227 * auVar284._8_4_;
  auVar348._12_4_ = fVar263 * auVar15._12_4_ + fVar265 * auVar212._12_4_ + fVar230 * auVar284._12_4_
  ;
  auVar269 = vsubps_avx(_local_3f8,auVar163);
  auVar284 = vshufps_avx(auVar269,auVar269,0xaa);
  auVar212 = vmovshdup_avx(auVar269);
  auVar15 = vmovsldup_avx(auVar269);
  auVar361._0_4_ = fVar232 * auVar15._0_4_ + fVar245 * auVar212._0_4_ + fVar206 * auVar284._0_4_;
  auVar361._4_4_ = fVar248 * auVar15._4_4_ + fVar264 * auVar212._4_4_ + fVar225 * auVar284._4_4_;
  auVar361._8_4_ = fVar244 * auVar15._8_4_ + fVar246 * auVar212._8_4_ + fVar227 * auVar284._8_4_;
  auVar361._12_4_ = fVar263 * auVar15._12_4_ + fVar265 * auVar212._12_4_ + fVar230 * auVar284._12_4_
  ;
  auVar63._4_4_ = fVar118;
  auVar63._0_4_ = fVar80;
  auVar63._8_4_ = fVar203;
  auVar63._12_4_ = fVar226;
  auVar17 = vsubps_avx(auVar63,auVar163);
  auVar284 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar212 = vmovshdup_avx(auVar17);
  auVar15 = vmovsldup_avx(auVar17);
  auVar272._0_4_ = auVar15._0_4_ * fVar232 + auVar212._0_4_ * fVar245 + fVar206 * auVar284._0_4_;
  auVar272._4_4_ = auVar15._4_4_ * fVar248 + auVar212._4_4_ * fVar264 + fVar225 * auVar284._4_4_;
  auVar272._8_4_ = auVar15._8_4_ * fVar244 + auVar212._8_4_ * fVar246 + fVar227 * auVar284._8_4_;
  auVar272._12_4_ = auVar15._12_4_ * fVar263 + auVar212._12_4_ * fVar265 + fVar230 * auVar284._12_4_
  ;
  auVar20 = vsubps_avx(_local_408,auVar163);
  auVar284 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar212 = vmovshdup_avx(auVar20);
  auVar15 = vmovsldup_avx(auVar20);
  auVar287._0_4_ = auVar15._0_4_ * fVar232 + auVar212._0_4_ * fVar245 + auVar284._0_4_ * fVar206;
  auVar287._4_4_ = auVar15._4_4_ * fVar248 + auVar212._4_4_ * fVar264 + auVar284._4_4_ * fVar225;
  auVar287._8_4_ = auVar15._8_4_ * fVar244 + auVar212._8_4_ * fVar246 + auVar284._8_4_ * fVar227;
  auVar287._12_4_ = auVar15._12_4_ * fVar263 + auVar212._12_4_ * fVar265 + auVar284._12_4_ * fVar230
  ;
  auVar83 = vsubps_avx(_local_418,auVar163);
  auVar284 = vshufps_avx(auVar83,auVar83,0xaa);
  auVar212 = vmovshdup_avx(auVar83);
  auVar15 = vmovsldup_avx(auVar83);
  auVar301._0_4_ = auVar15._0_4_ * fVar232 + auVar212._0_4_ * fVar245 + auVar284._0_4_ * fVar206;
  auVar301._4_4_ = auVar15._4_4_ * fVar248 + auVar212._4_4_ * fVar264 + auVar284._4_4_ * fVar225;
  auVar301._8_4_ = auVar15._8_4_ * fVar244 + auVar212._8_4_ * fVar246 + auVar284._8_4_ * fVar227;
  auVar301._12_4_ = auVar15._12_4_ * fVar263 + auVar212._12_4_ * fVar265 + auVar284._12_4_ * fVar230
  ;
  auVar67._4_4_ = fStack_424;
  auVar67._0_4_ = local_428;
  auVar67._8_4_ = fStack_420;
  auVar67._12_4_ = fStack_41c;
  auVar84 = vsubps_avx(auVar67,auVar163);
  auVar284 = vshufps_avx(auVar84,auVar84,0xaa);
  auVar212 = vmovshdup_avx(auVar84);
  auVar15 = vmovsldup_avx(auVar84);
  auVar317._0_4_ = auVar15._0_4_ * fVar232 + auVar212._0_4_ * fVar245 + auVar284._0_4_ * fVar206;
  auVar317._4_4_ = auVar15._4_4_ * fVar248 + auVar212._4_4_ * fVar264 + auVar284._4_4_ * fVar225;
  auVar317._8_4_ = auVar15._8_4_ * fVar244 + auVar212._8_4_ * fVar246 + auVar284._8_4_ * fVar227;
  auVar317._12_4_ = auVar15._12_4_ * fVar263 + auVar212._12_4_ * fVar265 + auVar284._12_4_ * fVar230
  ;
  auVar61._4_4_ = fVar187;
  auVar61._0_4_ = fVar81;
  auVar61._8_4_ = fVar204;
  auVar61._12_4_ = fVar228;
  auVar124 = vsubps_avx(auVar61,auVar163);
  auVar15 = vshufps_avx(auVar124,auVar124,0xaa);
  auVar163 = vmovshdup_avx(auVar124);
  auVar212 = vmovsldup_avx(auVar124);
  auVar94._0_4_ = fVar232 * auVar212._0_4_ + fVar245 * auVar163._0_4_ + fVar206 * auVar15._0_4_;
  auVar94._4_4_ = fVar248 * auVar212._4_4_ + fVar264 * auVar163._4_4_ + fVar225 * auVar15._4_4_;
  auVar94._8_4_ = fVar244 * auVar212._8_4_ + fVar246 * auVar163._8_4_ + fVar227 * auVar15._8_4_;
  auVar94._12_4_ = fVar263 * auVar212._12_4_ + fVar265 * auVar163._12_4_ + fVar230 * auVar15._12_4_;
  auVar284 = vmovlhps_avx(auVar337,auVar287);
  auVar16 = vmovlhps_avx(auVar348,auVar301);
  auVar162 = vmovlhps_avx(auVar361,auVar317);
  auVar14 = vmovlhps_avx(auVar272,auVar94);
  auVar163 = vminps_avx(auVar284,auVar16);
  auVar212 = vminps_avx(auVar162,auVar14);
  auVar15 = vminps_avx(auVar163,auVar212);
  auVar163 = vmaxps_avx(auVar284,auVar16);
  auVar212 = vmaxps_avx(auVar162,auVar14);
  auVar163 = vmaxps_avx(auVar163,auVar212);
  auVar212 = vshufpd_avx(auVar15,auVar15,3);
  auVar15 = vminps_avx(auVar15,auVar212);
  auVar212 = vshufpd_avx(auVar163,auVar163,3);
  auVar212 = vmaxps_avx(auVar163,auVar212);
  auVar257._8_4_ = 0x7fffffff;
  auVar257._0_8_ = 0x7fffffff7fffffff;
  auVar257._12_4_ = 0x7fffffff;
  auVar163 = vandps_avx(auVar15,auVar257);
  auVar212 = vandps_avx(auVar212,auVar257);
  auVar163 = vmaxps_avx(auVar163,auVar212);
  auVar212 = vmovshdup_avx(auVar163);
  auVar163 = vmaxss_avx(auVar212,auVar163);
  fVar248 = auVar163._0_4_ * 9.536743e-07;
  auVar163 = vshufps_avx(ZEXT416((uint)fVar248),ZEXT416((uint)fVar248),0);
  local_78._16_16_ = auVar163;
  local_78._0_16_ = auVar163;
  auVar95._0_8_ = auVar163._0_8_ ^ 0x8000000080000000;
  auVar95._8_4_ = auVar163._8_4_ ^ 0x80000000;
  auVar95._12_4_ = auVar163._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar95;
  local_98._0_16_ = auVar95;
  auVar163 = vpshufd_avx(ZEXT416(uVar69),0);
  auVar212 = vpshufd_avx(ZEXT416(*(uint *)(local_430 + lVar72 * 4 + 6)),0);
  bVar77 = false;
  uVar73 = 0;
  fVar232 = *(float *)(ray + k * 4 + 0x30);
  auVar15 = vsubps_avx(auVar16,auVar284);
  auVar155 = vsubps_avx(auVar162,auVar16);
  auVar82 = vsubps_avx(auVar14,auVar162);
  auVar123 = vsubps_avx(_local_408,_local_3e8);
  auVar66._4_4_ = fVar117;
  auVar66._0_4_ = fVar79;
  auVar66._8_4_ = fVar202;
  auVar66._12_4_ = fVar207;
  auVar154 = vsubps_avx(_local_418,auVar66);
  auVar156 = vsubps_avx(auVar67,_local_3f8);
  auVar62._4_4_ = fVar187;
  auVar62._0_4_ = fVar81;
  auVar62._8_4_ = fVar204;
  auVar62._12_4_ = fVar228;
  auVar64._4_4_ = fVar118;
  auVar64._0_4_ = fVar80;
  auVar64._8_4_ = fVar203;
  auVar64._12_4_ = fVar226;
  auVar188 = vsubps_avx(auVar62,auVar64);
  auVar357 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar363 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0094b61b:
  do {
    auVar277 = auVar363._0_16_;
    auVar267 = auVar357._0_16_;
    auVar99 = vshufps_avx(auVar267,auVar267,0x50);
    auVar352._8_4_ = 0x3f800000;
    auVar352._0_8_ = 0x3f8000003f800000;
    auVar352._12_4_ = 0x3f800000;
    auVar356._16_4_ = 0x3f800000;
    auVar356._0_16_ = auVar352;
    auVar356._20_4_ = 0x3f800000;
    auVar356._24_4_ = 0x3f800000;
    auVar356._28_4_ = 0x3f800000;
    auVar189 = vsubps_avx(auVar352,auVar99);
    fVar244 = auVar99._0_4_;
    fVar263 = auVar99._4_4_;
    fVar245 = auVar99._8_4_;
    fVar264 = auVar99._12_4_;
    fVar246 = auVar189._0_4_;
    fVar265 = auVar189._4_4_;
    fVar206 = auVar189._8_4_;
    fVar225 = auVar189._12_4_;
    auVar197._0_4_ = auVar287._0_4_ * fVar244 + fVar246 * auVar337._0_4_;
    auVar197._4_4_ = auVar287._4_4_ * fVar263 + fVar265 * auVar337._4_4_;
    auVar197._8_4_ = auVar287._0_4_ * fVar245 + fVar206 * auVar337._0_4_;
    auVar197._12_4_ = auVar287._4_4_ * fVar264 + fVar225 * auVar337._4_4_;
    auVar165._0_4_ = auVar301._0_4_ * fVar244 + auVar348._0_4_ * fVar246;
    auVar165._4_4_ = auVar301._4_4_ * fVar263 + auVar348._4_4_ * fVar265;
    auVar165._8_4_ = auVar301._0_4_ * fVar245 + auVar348._0_4_ * fVar206;
    auVar165._12_4_ = auVar301._4_4_ * fVar264 + auVar348._4_4_ * fVar225;
    auVar273._0_4_ = auVar317._0_4_ * fVar244 + auVar361._0_4_ * fVar246;
    auVar273._4_4_ = auVar317._4_4_ * fVar263 + auVar361._4_4_ * fVar265;
    auVar273._8_4_ = auVar317._0_4_ * fVar245 + auVar361._0_4_ * fVar206;
    auVar273._12_4_ = auVar317._4_4_ * fVar264 + auVar361._4_4_ * fVar225;
    auVar213._0_4_ = auVar94._0_4_ * fVar244 + auVar272._0_4_ * fVar246;
    auVar213._4_4_ = auVar94._4_4_ * fVar263 + auVar272._4_4_ * fVar265;
    auVar213._8_4_ = auVar94._0_4_ * fVar245 + auVar272._0_4_ * fVar206;
    auVar213._12_4_ = auVar94._4_4_ * fVar264 + auVar272._4_4_ * fVar225;
    auVar99 = vmovshdup_avx(auVar277);
    auVar189 = vshufps_avx(auVar277,auVar277,0);
    auVar304._16_16_ = auVar189;
    auVar304._0_16_ = auVar189;
    auVar182 = vshufps_avx(auVar277,auVar277,0x55);
    auVar112._16_16_ = auVar182;
    auVar112._0_16_ = auVar182;
    auVar111 = vsubps_avx(auVar112,auVar304);
    auVar182 = vshufps_avx(auVar197,auVar197,0);
    auVar144 = vshufps_avx(auVar197,auVar197,0x55);
    auVar132 = vshufps_avx(auVar165,auVar165,0);
    auVar168 = vshufps_avx(auVar165,auVar165,0x55);
    auVar133 = vshufps_avx(auVar273,auVar273,0);
    auVar233 = vshufps_avx(auVar273,auVar273,0x55);
    auVar250 = vshufps_avx(auVar213,auVar213,0);
    auVar266 = vshufps_avx(auVar213,auVar213,0x55);
    auVar99 = ZEXT416((uint)((auVar99._0_4_ - auVar363._0_4_) * 0.04761905));
    auVar99 = vshufps_avx(auVar99,auVar99,0);
    auVar322._0_4_ = auVar189._0_4_ + auVar111._0_4_ * 0.0;
    auVar322._4_4_ = auVar189._4_4_ + auVar111._4_4_ * 0.14285715;
    auVar322._8_4_ = auVar189._8_4_ + auVar111._8_4_ * 0.2857143;
    auVar322._12_4_ = auVar189._12_4_ + auVar111._12_4_ * 0.42857146;
    auVar322._16_4_ = auVar189._0_4_ + auVar111._16_4_ * 0.5714286;
    auVar322._20_4_ = auVar189._4_4_ + auVar111._20_4_ * 0.71428573;
    auVar322._24_4_ = auVar189._8_4_ + auVar111._24_4_ * 0.8571429;
    auVar322._28_4_ = auVar189._12_4_ + auVar111._28_4_;
    auVar21 = vsubps_avx(auVar356,auVar322);
    fVar244 = auVar132._0_4_;
    fVar245 = auVar132._4_4_;
    fVar246 = auVar132._8_4_;
    fVar206 = auVar132._12_4_;
    fVar298 = auVar21._0_4_;
    fVar306 = auVar21._4_4_;
    fVar307 = auVar21._8_4_;
    fVar308 = auVar21._12_4_;
    fVar309 = auVar21._16_4_;
    fVar310 = auVar21._20_4_;
    fVar311 = auVar21._24_4_;
    fVar294 = auVar168._0_4_;
    fVar295 = auVar168._4_4_;
    fVar296 = auVar168._8_4_;
    fVar297 = auVar168._12_4_;
    fVar350 = auVar144._12_4_ + 1.0;
    fVar247 = auVar133._0_4_;
    fVar229 = auVar133._4_4_;
    fVar276 = auVar133._8_4_;
    fVar249 = auVar133._12_4_;
    fVar227 = fVar247 * auVar322._0_4_ + fVar298 * fVar244;
    fVar230 = fVar229 * auVar322._4_4_ + fVar306 * fVar245;
    fVar231 = fVar276 * auVar322._8_4_ + fVar307 * fVar246;
    fVar119 = fVar249 * auVar322._12_4_ + fVar308 * fVar206;
    fVar120 = fVar247 * auVar322._16_4_ + fVar309 * fVar244;
    fVar121 = fVar229 * auVar322._20_4_ + fVar310 * fVar245;
    fVar122 = fVar276 * auVar322._24_4_ + fVar311 * fVar246;
    fVar263 = auVar233._0_4_;
    fVar264 = auVar233._4_4_;
    fVar265 = auVar233._8_4_;
    fVar225 = auVar233._12_4_;
    fVar330 = fVar294 * fVar298 + auVar322._0_4_ * fVar263;
    fVar339 = fVar295 * fVar306 + auVar322._4_4_ * fVar264;
    fVar340 = fVar296 * fVar307 + auVar322._8_4_ * fVar265;
    fVar341 = fVar297 * fVar308 + auVar322._12_4_ * fVar225;
    fVar342 = fVar294 * fVar309 + auVar322._16_4_ * fVar263;
    fVar343 = fVar295 * fVar310 + auVar322._20_4_ * fVar264;
    fVar344 = fVar296 * fVar311 + auVar322._24_4_ * fVar265;
    fVar345 = fVar297 + fVar206;
    auVar189 = vshufps_avx(auVar197,auVar197,0xaa);
    auVar132 = vshufps_avx(auVar197,auVar197,0xff);
    fVar205 = fVar249 + 0.0;
    auVar168 = vshufps_avx(auVar165,auVar165,0xaa);
    auVar133 = vshufps_avx(auVar165,auVar165,0xff);
    auVar223._0_4_ =
         fVar298 * (auVar322._0_4_ * fVar244 + fVar298 * auVar182._0_4_) + auVar322._0_4_ * fVar227;
    auVar223._4_4_ =
         fVar306 * (auVar322._4_4_ * fVar245 + fVar306 * auVar182._4_4_) + auVar322._4_4_ * fVar230;
    auVar223._8_4_ =
         fVar307 * (auVar322._8_4_ * fVar246 + fVar307 * auVar182._8_4_) + auVar322._8_4_ * fVar231;
    auVar223._12_4_ =
         fVar308 * (auVar322._12_4_ * fVar206 + fVar308 * auVar182._12_4_) +
         auVar322._12_4_ * fVar119;
    auVar223._16_4_ =
         fVar309 * (auVar322._16_4_ * fVar244 + fVar309 * auVar182._0_4_) +
         auVar322._16_4_ * fVar120;
    auVar223._20_4_ =
         fVar310 * (auVar322._20_4_ * fVar245 + fVar310 * auVar182._4_4_) +
         auVar322._20_4_ * fVar121;
    auVar223._24_4_ =
         fVar311 * (auVar322._24_4_ * fVar246 + fVar311 * auVar182._8_4_) +
         auVar322._24_4_ * fVar122;
    auVar223._28_4_ = auVar182._12_4_ + 1.0 + fVar225;
    auVar242._0_4_ =
         fVar298 * (fVar294 * auVar322._0_4_ + auVar144._0_4_ * fVar298) + auVar322._0_4_ * fVar330;
    auVar242._4_4_ =
         fVar306 * (fVar295 * auVar322._4_4_ + auVar144._4_4_ * fVar306) + auVar322._4_4_ * fVar339;
    auVar242._8_4_ =
         fVar307 * (fVar296 * auVar322._8_4_ + auVar144._8_4_ * fVar307) + auVar322._8_4_ * fVar340;
    auVar242._12_4_ =
         fVar308 * (fVar297 * auVar322._12_4_ + auVar144._12_4_ * fVar308) +
         auVar322._12_4_ * fVar341;
    auVar242._16_4_ =
         fVar309 * (fVar294 * auVar322._16_4_ + auVar144._0_4_ * fVar309) +
         auVar322._16_4_ * fVar342;
    auVar242._20_4_ =
         fVar310 * (fVar295 * auVar322._20_4_ + auVar144._4_4_ * fVar310) +
         auVar322._20_4_ * fVar343;
    auVar242._24_4_ =
         fVar311 * (fVar296 * auVar322._24_4_ + auVar144._8_4_ * fVar311) +
         auVar322._24_4_ * fVar344;
    auVar242._28_4_ = auVar266._12_4_ + fVar225;
    auVar113._0_4_ =
         fVar298 * fVar227 + auVar322._0_4_ * (fVar247 * fVar298 + auVar250._0_4_ * auVar322._0_4_);
    auVar113._4_4_ =
         fVar306 * fVar230 + auVar322._4_4_ * (fVar229 * fVar306 + auVar250._4_4_ * auVar322._4_4_);
    auVar113._8_4_ =
         fVar307 * fVar231 + auVar322._8_4_ * (fVar276 * fVar307 + auVar250._8_4_ * auVar322._8_4_);
    auVar113._12_4_ =
         fVar308 * fVar119 +
         auVar322._12_4_ * (fVar249 * fVar308 + auVar250._12_4_ * auVar322._12_4_);
    auVar113._16_4_ =
         fVar309 * fVar120 +
         auVar322._16_4_ * (fVar247 * fVar309 + auVar250._0_4_ * auVar322._16_4_);
    auVar113._20_4_ =
         fVar310 * fVar121 +
         auVar322._20_4_ * (fVar229 * fVar310 + auVar250._4_4_ * auVar322._20_4_);
    auVar113._24_4_ =
         fVar311 * fVar122 +
         auVar322._24_4_ * (fVar276 * fVar311 + auVar250._8_4_ * auVar322._24_4_);
    auVar113._28_4_ = fVar206 + 1.0 + fVar205;
    auVar329._0_4_ =
         fVar298 * fVar330 + auVar322._0_4_ * (auVar266._0_4_ * auVar322._0_4_ + fVar298 * fVar263);
    auVar329._4_4_ =
         fVar306 * fVar339 + auVar322._4_4_ * (auVar266._4_4_ * auVar322._4_4_ + fVar306 * fVar264);
    auVar329._8_4_ =
         fVar307 * fVar340 + auVar322._8_4_ * (auVar266._8_4_ * auVar322._8_4_ + fVar307 * fVar265);
    auVar329._12_4_ =
         fVar308 * fVar341 +
         auVar322._12_4_ * (auVar266._12_4_ * auVar322._12_4_ + fVar308 * fVar225);
    auVar329._16_4_ =
         fVar309 * fVar342 +
         auVar322._16_4_ * (auVar266._0_4_ * auVar322._16_4_ + fVar309 * fVar263);
    auVar329._20_4_ =
         fVar310 * fVar343 +
         auVar322._20_4_ * (auVar266._4_4_ * auVar322._20_4_ + fVar310 * fVar264);
    auVar329._24_4_ =
         fVar311 * fVar344 +
         auVar322._24_4_ * (auVar266._8_4_ * auVar322._24_4_ + fVar311 * fVar265);
    auVar329._28_4_ = fVar205 + fVar225 + 0.0;
    local_b8._0_4_ = fVar298 * auVar223._0_4_ + auVar322._0_4_ * auVar113._0_4_;
    local_b8._4_4_ = fVar306 * auVar223._4_4_ + auVar322._4_4_ * auVar113._4_4_;
    local_b8._8_4_ = fVar307 * auVar223._8_4_ + auVar322._8_4_ * auVar113._8_4_;
    local_b8._12_4_ = fVar308 * auVar223._12_4_ + auVar322._12_4_ * auVar113._12_4_;
    local_b8._16_4_ = fVar309 * auVar223._16_4_ + auVar322._16_4_ * auVar113._16_4_;
    local_b8._20_4_ = fVar310 * auVar223._20_4_ + auVar322._20_4_ * auVar113._20_4_;
    local_b8._24_4_ = fVar311 * auVar223._24_4_ + auVar322._24_4_ * auVar113._24_4_;
    local_b8._28_4_ = fVar345 + fVar225 + 0.0;
    auVar201._0_4_ = fVar298 * auVar242._0_4_ + auVar322._0_4_ * auVar329._0_4_;
    auVar201._4_4_ = fVar306 * auVar242._4_4_ + auVar322._4_4_ * auVar329._4_4_;
    auVar201._8_4_ = fVar307 * auVar242._8_4_ + auVar322._8_4_ * auVar329._8_4_;
    auVar201._12_4_ = fVar308 * auVar242._12_4_ + auVar322._12_4_ * auVar329._12_4_;
    auVar201._16_4_ = fVar309 * auVar242._16_4_ + auVar322._16_4_ * auVar329._16_4_;
    auVar201._20_4_ = fVar310 * auVar242._20_4_ + auVar322._20_4_ * auVar329._20_4_;
    auVar201._24_4_ = fVar311 * auVar242._24_4_ + auVar322._24_4_ * auVar329._24_4_;
    auVar201._28_4_ = fVar345 + fVar205;
    auVar22 = vsubps_avx(auVar113,auVar223);
    auVar111 = vsubps_avx(auVar329,auVar242);
    local_518 = auVar99._0_4_;
    fStack_514 = auVar99._4_4_;
    fStack_510 = auVar99._8_4_;
    fStack_50c = auVar99._12_4_;
    local_f8 = local_518 * auVar22._0_4_ * 3.0;
    fStack_f4 = fStack_514 * auVar22._4_4_ * 3.0;
    auVar23._4_4_ = fStack_f4;
    auVar23._0_4_ = local_f8;
    fStack_f0 = fStack_510 * auVar22._8_4_ * 3.0;
    auVar23._8_4_ = fStack_f0;
    fStack_ec = fStack_50c * auVar22._12_4_ * 3.0;
    auVar23._12_4_ = fStack_ec;
    fStack_e8 = local_518 * auVar22._16_4_ * 3.0;
    auVar23._16_4_ = fStack_e8;
    fStack_e4 = fStack_514 * auVar22._20_4_ * 3.0;
    auVar23._20_4_ = fStack_e4;
    fStack_e0 = fStack_510 * auVar22._24_4_ * 3.0;
    auVar23._24_4_ = fStack_e0;
    auVar23._28_4_ = auVar22._28_4_;
    local_118 = local_518 * auVar111._0_4_ * 3.0;
    fStack_114 = fStack_514 * auVar111._4_4_ * 3.0;
    auVar24._4_4_ = fStack_114;
    auVar24._0_4_ = local_118;
    fStack_110 = fStack_510 * auVar111._8_4_ * 3.0;
    auVar24._8_4_ = fStack_110;
    fStack_10c = fStack_50c * auVar111._12_4_ * 3.0;
    auVar24._12_4_ = fStack_10c;
    fStack_108 = local_518 * auVar111._16_4_ * 3.0;
    auVar24._16_4_ = fStack_108;
    fStack_104 = fStack_514 * auVar111._20_4_ * 3.0;
    auVar24._20_4_ = fStack_104;
    fStack_100 = fStack_510 * auVar111._24_4_ * 3.0;
    auVar24._24_4_ = fStack_100;
    auVar24._28_4_ = fVar345;
    auVar23 = vsubps_avx(local_b8,auVar23);
    auVar111 = vperm2f128_avx(auVar23,auVar23,1);
    auVar111 = vshufps_avx(auVar111,auVar23,0x30);
    auVar111 = vshufps_avx(auVar23,auVar111,0x29);
    auVar24 = vsubps_avx(auVar201,auVar24);
    auVar23 = vperm2f128_avx(auVar24,auVar24,1);
    auVar23 = vshufps_avx(auVar23,auVar24,0x30);
    auVar24 = vshufps_avx(auVar24,auVar23,0x29);
    fVar343 = auVar168._0_4_;
    fVar344 = auVar168._4_4_;
    fVar364 = auVar168._8_4_;
    fVar206 = auVar189._12_4_;
    fVar229 = auVar133._0_4_;
    fVar249 = auVar133._4_4_;
    fVar330 = auVar133._8_4_;
    fVar339 = auVar133._12_4_;
    auVar99 = vshufps_avx(auVar273,auVar273,0xaa);
    fVar244 = auVar99._0_4_;
    fVar245 = auVar99._4_4_;
    fVar246 = auVar99._8_4_;
    fVar225 = auVar99._12_4_;
    fVar231 = auVar322._0_4_ * fVar244 + fVar343 * fVar298;
    fVar119 = auVar322._4_4_ * fVar245 + fVar344 * fVar306;
    fVar120 = auVar322._8_4_ * fVar246 + fVar364 * fVar307;
    fVar121 = auVar322._12_4_ * fVar225 + auVar168._12_4_ * fVar308;
    fVar122 = auVar322._16_4_ * fVar244 + fVar343 * fVar309;
    fVar205 = auVar322._20_4_ * fVar245 + fVar344 * fVar310;
    fVar247 = auVar322._24_4_ * fVar246 + fVar364 * fVar311;
    auVar99 = vshufps_avx(auVar273,auVar273,0xff);
    fVar263 = auVar99._0_4_;
    fVar264 = auVar99._4_4_;
    fVar265 = auVar99._8_4_;
    fVar227 = auVar99._12_4_;
    fVar276 = auVar322._0_4_ * fVar263 + fVar229 * fVar298;
    fVar294 = auVar322._4_4_ * fVar264 + fVar249 * fVar306;
    fVar295 = auVar322._8_4_ * fVar265 + fVar330 * fVar307;
    fVar296 = auVar322._12_4_ * fVar227 + fVar339 * fVar308;
    fVar340 = auVar322._16_4_ * fVar263 + fVar229 * fVar309;
    fVar297 = auVar322._20_4_ * fVar264 + fVar249 * fVar310;
    fVar341 = auVar322._24_4_ * fVar265 + fVar330 * fVar311;
    auVar99 = vshufps_avx(auVar213,auVar213,0xaa);
    fVar342 = auVar99._12_4_ + fVar225;
    auVar182 = vshufps_avx(auVar213,auVar213,0xff);
    fVar230 = auVar182._12_4_;
    auVar114._0_4_ =
         fVar298 * (fVar343 * auVar322._0_4_ + fVar298 * auVar189._0_4_) + auVar322._0_4_ * fVar231;
    auVar114._4_4_ =
         fVar306 * (fVar344 * auVar322._4_4_ + fVar306 * auVar189._4_4_) + auVar322._4_4_ * fVar119;
    auVar114._8_4_ =
         fVar307 * (fVar364 * auVar322._8_4_ + fVar307 * auVar189._8_4_) + auVar322._8_4_ * fVar120;
    auVar114._12_4_ =
         fVar308 * (auVar168._12_4_ * auVar322._12_4_ + fVar308 * fVar206) +
         auVar322._12_4_ * fVar121;
    auVar114._16_4_ =
         fVar309 * (fVar343 * auVar322._16_4_ + fVar309 * auVar189._0_4_) +
         auVar322._16_4_ * fVar122;
    auVar114._20_4_ =
         fVar310 * (fVar344 * auVar322._20_4_ + fVar310 * auVar189._4_4_) +
         auVar322._20_4_ * fVar205;
    auVar114._24_4_ =
         fVar311 * (fVar364 * auVar322._24_4_ + fVar311 * auVar189._8_4_) +
         auVar322._24_4_ * fVar247;
    auVar114._28_4_ = auVar24._28_4_ + fVar206 + fVar230;
    auVar150._0_4_ =
         fVar298 * (fVar229 * auVar322._0_4_ + auVar132._0_4_ * fVar298) + auVar322._0_4_ * fVar276;
    auVar150._4_4_ =
         fVar306 * (fVar249 * auVar322._4_4_ + auVar132._4_4_ * fVar306) + auVar322._4_4_ * fVar294;
    auVar150._8_4_ =
         fVar307 * (fVar330 * auVar322._8_4_ + auVar132._8_4_ * fVar307) + auVar322._8_4_ * fVar295;
    auVar150._12_4_ =
         fVar308 * (fVar339 * auVar322._12_4_ + auVar132._12_4_ * fVar308) +
         auVar322._12_4_ * fVar296;
    auVar150._16_4_ =
         fVar309 * (fVar229 * auVar322._16_4_ + auVar132._0_4_ * fVar309) +
         auVar322._16_4_ * fVar340;
    auVar150._20_4_ =
         fVar310 * (fVar249 * auVar322._20_4_ + auVar132._4_4_ * fVar310) +
         auVar322._20_4_ * fVar297;
    auVar150._24_4_ =
         fVar311 * (fVar330 * auVar322._24_4_ + auVar132._8_4_ * fVar311) +
         auVar322._24_4_ * fVar341;
    auVar150._28_4_ = fVar206 + auVar23._28_4_ + fVar230;
    auVar23 = vperm2f128_avx(local_b8,local_b8,1);
    auVar23 = vshufps_avx(auVar23,local_b8,0x30);
    auVar112 = vshufps_avx(local_b8,auVar23,0x29);
    auVar243._0_4_ =
         auVar322._0_4_ * (auVar99._0_4_ * auVar322._0_4_ + fVar298 * fVar244) + fVar298 * fVar231;
    auVar243._4_4_ =
         auVar322._4_4_ * (auVar99._4_4_ * auVar322._4_4_ + fVar306 * fVar245) + fVar306 * fVar119;
    auVar243._8_4_ =
         auVar322._8_4_ * (auVar99._8_4_ * auVar322._8_4_ + fVar307 * fVar246) + fVar307 * fVar120;
    auVar243._12_4_ =
         auVar322._12_4_ * (auVar99._12_4_ * auVar322._12_4_ + fVar308 * fVar225) +
         fVar308 * fVar121;
    auVar243._16_4_ =
         auVar322._16_4_ * (auVar99._0_4_ * auVar322._16_4_ + fVar309 * fVar244) + fVar309 * fVar122
    ;
    auVar243._20_4_ =
         auVar322._20_4_ * (auVar99._4_4_ * auVar322._20_4_ + fVar310 * fVar245) + fVar310 * fVar205
    ;
    auVar243._24_4_ =
         auVar322._24_4_ * (auVar99._8_4_ * auVar322._24_4_ + fVar311 * fVar246) + fVar311 * fVar247
    ;
    auVar243._28_4_ = fVar342 + fVar350 + auVar242._28_4_;
    auVar293._0_4_ =
         fVar298 * fVar276 + auVar322._0_4_ * (auVar322._0_4_ * auVar182._0_4_ + fVar298 * fVar263);
    auVar293._4_4_ =
         fVar306 * fVar294 + auVar322._4_4_ * (auVar322._4_4_ * auVar182._4_4_ + fVar306 * fVar264);
    auVar293._8_4_ =
         fVar307 * fVar295 + auVar322._8_4_ * (auVar322._8_4_ * auVar182._8_4_ + fVar307 * fVar265);
    auVar293._12_4_ =
         fVar308 * fVar296 + auVar322._12_4_ * (auVar322._12_4_ * fVar230 + fVar308 * fVar227);
    auVar293._16_4_ =
         fVar309 * fVar340 +
         auVar322._16_4_ * (auVar322._16_4_ * auVar182._0_4_ + fVar309 * fVar263);
    auVar293._20_4_ =
         fVar310 * fVar297 +
         auVar322._20_4_ * (auVar322._20_4_ * auVar182._4_4_ + fVar310 * fVar264);
    auVar293._24_4_ =
         fVar311 * fVar341 +
         auVar322._24_4_ * (auVar322._24_4_ * auVar182._8_4_ + fVar311 * fVar265);
    auVar293._28_4_ = fVar350 + fVar339 + fVar230 + fVar227;
    auVar275._0_4_ = fVar298 * auVar114._0_4_ + auVar322._0_4_ * auVar243._0_4_;
    auVar275._4_4_ = fVar306 * auVar114._4_4_ + auVar322._4_4_ * auVar243._4_4_;
    auVar275._8_4_ = fVar307 * auVar114._8_4_ + auVar322._8_4_ * auVar243._8_4_;
    auVar275._12_4_ = fVar308 * auVar114._12_4_ + auVar322._12_4_ * auVar243._12_4_;
    auVar275._16_4_ = fVar309 * auVar114._16_4_ + auVar322._16_4_ * auVar243._16_4_;
    auVar275._20_4_ = fVar310 * auVar114._20_4_ + auVar322._20_4_ * auVar243._20_4_;
    auVar275._24_4_ = fVar311 * auVar114._24_4_ + auVar322._24_4_ * auVar243._24_4_;
    auVar275._28_4_ = fVar342 + fVar230 + fVar227;
    auVar305._0_4_ = fVar298 * auVar150._0_4_ + auVar322._0_4_ * auVar293._0_4_;
    auVar305._4_4_ = fVar306 * auVar150._4_4_ + auVar322._4_4_ * auVar293._4_4_;
    auVar305._8_4_ = fVar307 * auVar150._8_4_ + auVar322._8_4_ * auVar293._8_4_;
    auVar305._12_4_ = fVar308 * auVar150._12_4_ + auVar322._12_4_ * auVar293._12_4_;
    auVar305._16_4_ = fVar309 * auVar150._16_4_ + auVar322._16_4_ * auVar293._16_4_;
    auVar305._20_4_ = fVar310 * auVar150._20_4_ + auVar322._20_4_ * auVar293._20_4_;
    auVar305._24_4_ = fVar311 * auVar150._24_4_ + auVar322._24_4_ * auVar293._24_4_;
    auVar305._28_4_ = auVar21._28_4_ + auVar322._28_4_;
    auVar25 = vsubps_avx(auVar243,auVar114);
    auVar23 = vsubps_avx(auVar293,auVar150);
    local_138 = local_518 * auVar25._0_4_ * 3.0;
    fStack_134 = fStack_514 * auVar25._4_4_ * 3.0;
    auVar21._4_4_ = fStack_134;
    auVar21._0_4_ = local_138;
    fStack_130 = fStack_510 * auVar25._8_4_ * 3.0;
    auVar21._8_4_ = fStack_130;
    fStack_12c = fStack_50c * auVar25._12_4_ * 3.0;
    auVar21._12_4_ = fStack_12c;
    fStack_128 = local_518 * auVar25._16_4_ * 3.0;
    auVar21._16_4_ = fStack_128;
    fStack_124 = fStack_514 * auVar25._20_4_ * 3.0;
    auVar21._20_4_ = fStack_124;
    fStack_120 = fStack_510 * auVar25._24_4_ * 3.0;
    auVar21._24_4_ = fStack_120;
    auVar21._28_4_ = auVar25._28_4_;
    local_158 = local_518 * auVar23._0_4_ * 3.0;
    fStack_154 = fStack_514 * auVar23._4_4_ * 3.0;
    auVar26._4_4_ = fStack_154;
    auVar26._0_4_ = local_158;
    fStack_150 = fStack_510 * auVar23._8_4_ * 3.0;
    auVar26._8_4_ = fStack_150;
    fStack_14c = fStack_50c * auVar23._12_4_ * 3.0;
    auVar26._12_4_ = fStack_14c;
    fStack_148 = local_518 * auVar23._16_4_ * 3.0;
    auVar26._16_4_ = fStack_148;
    fStack_144 = fStack_514 * auVar23._20_4_ * 3.0;
    auVar26._20_4_ = fStack_144;
    fStack_140 = fStack_510 * auVar23._24_4_ * 3.0;
    auVar26._24_4_ = fStack_140;
    auVar26._28_4_ = auVar243._28_4_;
    auVar23 = vperm2f128_avx(auVar275,auVar275,1);
    auVar23 = vshufps_avx(auVar23,auVar275,0x30);
    auVar113 = vshufps_avx(auVar275,auVar23,0x29);
    auVar21 = vsubps_avx(auVar275,auVar21);
    auVar23 = vperm2f128_avx(auVar21,auVar21,1);
    auVar23 = vshufps_avx(auVar23,auVar21,0x30);
    auVar23 = vshufps_avx(auVar21,auVar23,0x29);
    auVar26 = vsubps_avx(auVar305,auVar26);
    auVar21 = vperm2f128_avx(auVar26,auVar26,1);
    auVar21 = vshufps_avx(auVar21,auVar26,0x30);
    auVar26 = vshufps_avx(auVar26,auVar21,0x29);
    auVar27 = vsubps_avx(auVar275,local_b8);
    auVar150 = vsubps_avx(auVar113,auVar112);
    fVar244 = auVar150._0_4_ + auVar27._0_4_;
    fVar263 = auVar150._4_4_ + auVar27._4_4_;
    fVar245 = auVar150._8_4_ + auVar27._8_4_;
    fVar264 = auVar150._12_4_ + auVar27._12_4_;
    fVar246 = auVar150._16_4_ + auVar27._16_4_;
    fVar265 = auVar150._20_4_ + auVar27._20_4_;
    fVar206 = auVar150._24_4_ + auVar27._24_4_;
    auVar21 = vperm2f128_avx(auVar201,auVar201,1);
    auVar21 = vshufps_avx(auVar21,auVar201,0x30);
    local_d8 = vshufps_avx(auVar201,auVar21,0x29);
    auVar21 = vperm2f128_avx(auVar305,auVar305,1);
    auVar21 = vshufps_avx(auVar21,auVar305,0x30);
    auVar114 = vshufps_avx(auVar305,auVar21,0x29);
    auVar21 = vsubps_avx(auVar305,auVar201);
    auVar223 = vsubps_avx(auVar114,local_d8);
    fVar225 = auVar223._0_4_ + auVar21._0_4_;
    fVar227 = auVar223._4_4_ + auVar21._4_4_;
    fVar230 = auVar223._8_4_ + auVar21._8_4_;
    fVar231 = auVar223._12_4_ + auVar21._12_4_;
    fVar119 = auVar223._16_4_ + auVar21._16_4_;
    fVar120 = auVar223._20_4_ + auVar21._20_4_;
    fVar121 = auVar223._24_4_ + auVar21._24_4_;
    auVar28._4_4_ = fVar263 * auVar201._4_4_;
    auVar28._0_4_ = fVar244 * auVar201._0_4_;
    auVar28._8_4_ = fVar245 * auVar201._8_4_;
    auVar28._12_4_ = fVar264 * auVar201._12_4_;
    auVar28._16_4_ = fVar246 * auVar201._16_4_;
    auVar28._20_4_ = fVar265 * auVar201._20_4_;
    auVar28._24_4_ = fVar206 * auVar201._24_4_;
    auVar28._28_4_ = auVar21._28_4_;
    auVar29._4_4_ = fVar227 * local_b8._4_4_;
    auVar29._0_4_ = fVar225 * local_b8._0_4_;
    auVar29._8_4_ = fVar230 * local_b8._8_4_;
    auVar29._12_4_ = fVar231 * local_b8._12_4_;
    auVar29._16_4_ = fVar119 * local_b8._16_4_;
    auVar29._20_4_ = fVar120 * local_b8._20_4_;
    auVar29._24_4_ = fVar121 * local_b8._24_4_;
    auVar29._28_4_ = fVar342;
    auVar28 = vsubps_avx(auVar28,auVar29);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar22._28_4_;
    local_118 = local_118 + auVar201._0_4_;
    fStack_114 = fStack_114 + auVar201._4_4_;
    fStack_110 = fStack_110 + auVar201._8_4_;
    fStack_10c = fStack_10c + auVar201._12_4_;
    fStack_108 = fStack_108 + auVar201._16_4_;
    fStack_104 = fStack_104 + auVar201._20_4_;
    fStack_100 = fStack_100 + auVar201._24_4_;
    fStack_fc = fVar345 + auVar201._28_4_;
    auVar22._4_4_ = fVar263 * fStack_114;
    auVar22._0_4_ = fVar244 * local_118;
    auVar22._8_4_ = fVar245 * fStack_110;
    auVar22._12_4_ = fVar264 * fStack_10c;
    auVar22._16_4_ = fVar246 * fStack_108;
    auVar22._20_4_ = fVar265 * fStack_104;
    auVar22._24_4_ = fVar206 * fStack_100;
    auVar22._28_4_ = fVar345;
    auVar30._4_4_ = fVar227 * fStack_f4;
    auVar30._0_4_ = fVar225 * local_f8;
    auVar30._8_4_ = fVar230 * fStack_f0;
    auVar30._12_4_ = fVar231 * fStack_ec;
    auVar30._16_4_ = fVar119 * fStack_e8;
    auVar30._20_4_ = fVar120 * fStack_e4;
    auVar30._24_4_ = fVar121 * fStack_e0;
    auVar30._28_4_ = fVar345 + auVar201._28_4_;
    auVar22 = vsubps_avx(auVar22,auVar30);
    local_5c8 = auVar24._0_4_;
    fStack_5c4 = auVar24._4_4_;
    fStack_5c0 = auVar24._8_4_;
    fStack_5bc = auVar24._12_4_;
    fStack_5b8 = auVar24._16_4_;
    fStack_5b4 = auVar24._20_4_;
    fStack_5b0 = auVar24._24_4_;
    auVar31._4_4_ = fVar263 * fStack_5c4;
    auVar31._0_4_ = fVar244 * local_5c8;
    auVar31._8_4_ = fVar245 * fStack_5c0;
    auVar31._12_4_ = fVar264 * fStack_5bc;
    auVar31._16_4_ = fVar246 * fStack_5b8;
    auVar31._20_4_ = fVar265 * fStack_5b4;
    auVar31._24_4_ = fVar206 * fStack_5b0;
    auVar31._28_4_ = fVar345;
    local_5a8._0_4_ = auVar111._0_4_;
    local_5a8._4_4_ = auVar111._4_4_;
    fStack_5a0 = auVar111._8_4_;
    fStack_59c = auVar111._12_4_;
    fStack_598 = auVar111._16_4_;
    fStack_594 = auVar111._20_4_;
    fStack_590 = auVar111._24_4_;
    auVar32._4_4_ = fVar227 * (float)local_5a8._4_4_;
    auVar32._0_4_ = fVar225 * (float)local_5a8._0_4_;
    auVar32._8_4_ = fVar230 * fStack_5a0;
    auVar32._12_4_ = fVar231 * fStack_59c;
    auVar32._16_4_ = fVar119 * fStack_598;
    auVar32._20_4_ = fVar120 * fStack_594;
    auVar32._24_4_ = fVar121 * fStack_590;
    auVar32._28_4_ = local_b8._28_4_;
    auVar29 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = local_d8._4_4_ * fVar263;
    auVar33._0_4_ = local_d8._0_4_ * fVar244;
    auVar33._8_4_ = local_d8._8_4_ * fVar245;
    auVar33._12_4_ = local_d8._12_4_ * fVar264;
    auVar33._16_4_ = local_d8._16_4_ * fVar246;
    auVar33._20_4_ = local_d8._20_4_ * fVar265;
    auVar33._24_4_ = local_d8._24_4_ * fVar206;
    auVar33._28_4_ = fVar345;
    auVar34._4_4_ = auVar112._4_4_ * fVar227;
    auVar34._0_4_ = auVar112._0_4_ * fVar225;
    auVar34._8_4_ = auVar112._8_4_ * fVar230;
    auVar34._12_4_ = auVar112._12_4_ * fVar231;
    auVar34._16_4_ = auVar112._16_4_ * fVar119;
    auVar34._20_4_ = auVar112._20_4_ * fVar120;
    auVar34._24_4_ = auVar112._24_4_ * fVar121;
    auVar34._28_4_ = local_d8._28_4_;
    local_518 = auVar23._0_4_;
    fStack_514 = auVar23._4_4_;
    fStack_510 = auVar23._8_4_;
    fStack_50c = auVar23._12_4_;
    fStack_508 = auVar23._16_4_;
    fStack_504 = auVar23._20_4_;
    fStack_500 = auVar23._24_4_;
    auVar30 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar305._4_4_ * fVar263;
    auVar35._0_4_ = auVar305._0_4_ * fVar244;
    auVar35._8_4_ = auVar305._8_4_ * fVar245;
    auVar35._12_4_ = auVar305._12_4_ * fVar264;
    auVar35._16_4_ = auVar305._16_4_ * fVar246;
    auVar35._20_4_ = auVar305._20_4_ * fVar265;
    auVar35._24_4_ = auVar305._24_4_ * fVar206;
    auVar35._28_4_ = fVar345;
    auVar36._4_4_ = fVar227 * auVar275._4_4_;
    auVar36._0_4_ = fVar225 * auVar275._0_4_;
    auVar36._8_4_ = fVar230 * auVar275._8_4_;
    auVar36._12_4_ = fVar231 * auVar275._12_4_;
    auVar36._16_4_ = fVar119 * auVar275._16_4_;
    auVar36._20_4_ = fVar120 * auVar275._20_4_;
    auVar36._24_4_ = fVar121 * auVar275._24_4_;
    auVar36._28_4_ = fStack_dc;
    auVar31 = vsubps_avx(auVar35,auVar36);
    local_138 = auVar275._0_4_ + local_138;
    fStack_134 = auVar275._4_4_ + fStack_134;
    fStack_130 = auVar275._8_4_ + fStack_130;
    fStack_12c = auVar275._12_4_ + fStack_12c;
    fStack_128 = auVar275._16_4_ + fStack_128;
    fStack_124 = auVar275._20_4_ + fStack_124;
    fStack_120 = auVar275._24_4_ + fStack_120;
    fStack_11c = auVar275._28_4_ + auVar25._28_4_;
    local_158 = auVar305._0_4_ + local_158;
    fStack_154 = auVar305._4_4_ + fStack_154;
    fStack_150 = auVar305._8_4_ + fStack_150;
    fStack_14c = auVar305._12_4_ + fStack_14c;
    fStack_148 = auVar305._16_4_ + fStack_148;
    fStack_144 = auVar305._20_4_ + fStack_144;
    fStack_140 = auVar305._24_4_ + fStack_140;
    fStack_13c = auVar305._28_4_ + auVar243._28_4_;
    auVar25._4_4_ = fVar263 * fStack_154;
    auVar25._0_4_ = fVar244 * local_158;
    auVar25._8_4_ = fVar245 * fStack_150;
    auVar25._12_4_ = fVar264 * fStack_14c;
    auVar25._16_4_ = fVar246 * fStack_148;
    auVar25._20_4_ = fVar265 * fStack_144;
    auVar25._24_4_ = fVar206 * fStack_140;
    auVar25._28_4_ = auVar305._28_4_ + auVar243._28_4_;
    auVar37._4_4_ = fStack_134 * fVar227;
    auVar37._0_4_ = local_138 * fVar225;
    auVar37._8_4_ = fStack_130 * fVar230;
    auVar37._12_4_ = fStack_12c * fVar231;
    auVar37._16_4_ = fStack_128 * fVar119;
    auVar37._20_4_ = fStack_124 * fVar120;
    auVar37._24_4_ = fStack_120 * fVar121;
    auVar37._28_4_ = fStack_11c;
    auVar25 = vsubps_avx(auVar25,auVar37);
    auVar38._4_4_ = fVar263 * auVar26._4_4_;
    auVar38._0_4_ = fVar244 * auVar26._0_4_;
    auVar38._8_4_ = fVar245 * auVar26._8_4_;
    auVar38._12_4_ = fVar264 * auVar26._12_4_;
    auVar38._16_4_ = fVar246 * auVar26._16_4_;
    auVar38._20_4_ = fVar265 * auVar26._20_4_;
    auVar38._24_4_ = fVar206 * auVar26._24_4_;
    auVar38._28_4_ = fStack_11c;
    auVar39._4_4_ = fVar227 * fStack_514;
    auVar39._0_4_ = fVar225 * local_518;
    auVar39._8_4_ = fVar230 * fStack_510;
    auVar39._12_4_ = fVar231 * fStack_50c;
    auVar39._16_4_ = fVar119 * fStack_508;
    auVar39._20_4_ = fVar120 * fStack_504;
    auVar39._24_4_ = fVar121 * fStack_500;
    auVar39._28_4_ = auVar26._28_4_;
    auVar32 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = fVar263 * auVar114._4_4_;
    auVar40._0_4_ = fVar244 * auVar114._0_4_;
    auVar40._8_4_ = fVar245 * auVar114._8_4_;
    auVar40._12_4_ = fVar264 * auVar114._12_4_;
    auVar40._16_4_ = fVar246 * auVar114._16_4_;
    auVar40._20_4_ = fVar265 * auVar114._20_4_;
    auVar40._24_4_ = fVar206 * auVar114._24_4_;
    auVar40._28_4_ = auVar150._28_4_ + auVar27._28_4_;
    auVar27._4_4_ = auVar113._4_4_ * fVar227;
    auVar27._0_4_ = auVar113._0_4_ * fVar225;
    auVar27._8_4_ = auVar113._8_4_ * fVar230;
    auVar27._12_4_ = auVar113._12_4_ * fVar231;
    auVar27._16_4_ = auVar113._16_4_ * fVar119;
    auVar27._20_4_ = auVar113._20_4_ * fVar120;
    auVar27._24_4_ = auVar113._24_4_ * fVar121;
    auVar27._28_4_ = auVar223._28_4_ + auVar21._28_4_;
    auVar27 = vsubps_avx(auVar40,auVar27);
    auVar23 = vminps_avx(auVar28,auVar22);
    auVar111 = vmaxps_avx(auVar28,auVar22);
    auVar24 = vminps_avx(auVar29,auVar30);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar29,auVar30);
    auVar111 = vmaxps_avx(auVar111,auVar23);
    auVar21 = vminps_avx(auVar31,auVar25);
    auVar23 = vmaxps_avx(auVar31,auVar25);
    auVar22 = vminps_avx(auVar32,auVar27);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar22 = vminps_avx(auVar24,auVar22);
    auVar24 = vmaxps_avx(auVar32,auVar27);
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar111,auVar23);
    auVar111 = vcmpps_avx(auVar22,local_78,2);
    auVar23 = vcmpps_avx(auVar23,local_98,5);
    auVar111 = vandps_avx(auVar23,auVar111);
    auVar23 = local_178 & auVar111;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(auVar112,local_b8);
      auVar24 = vsubps_avx(auVar113,auVar275);
      fVar263 = auVar23._0_4_ + auVar24._0_4_;
      fVar245 = auVar23._4_4_ + auVar24._4_4_;
      fVar264 = auVar23._8_4_ + auVar24._8_4_;
      fVar246 = auVar23._12_4_ + auVar24._12_4_;
      fVar265 = auVar23._16_4_ + auVar24._16_4_;
      fVar206 = auVar23._20_4_ + auVar24._20_4_;
      fVar225 = auVar23._24_4_ + auVar24._24_4_;
      auVar22 = vsubps_avx(local_d8,auVar201);
      auVar25 = vsubps_avx(auVar114,auVar305);
      fVar227 = auVar22._0_4_ + auVar25._0_4_;
      fVar230 = auVar22._4_4_ + auVar25._4_4_;
      fVar231 = auVar22._8_4_ + auVar25._8_4_;
      fVar119 = auVar22._12_4_ + auVar25._12_4_;
      fVar120 = auVar22._16_4_ + auVar25._16_4_;
      fVar121 = auVar22._20_4_ + auVar25._20_4_;
      fVar122 = auVar22._24_4_ + auVar25._24_4_;
      fVar244 = auVar25._28_4_;
      auVar41._4_4_ = auVar201._4_4_ * fVar245;
      auVar41._0_4_ = auVar201._0_4_ * fVar263;
      auVar41._8_4_ = auVar201._8_4_ * fVar264;
      auVar41._12_4_ = auVar201._12_4_ * fVar246;
      auVar41._16_4_ = auVar201._16_4_ * fVar265;
      auVar41._20_4_ = auVar201._20_4_ * fVar206;
      auVar41._24_4_ = auVar201._24_4_ * fVar225;
      auVar41._28_4_ = auVar201._28_4_;
      auVar42._4_4_ = local_b8._4_4_ * fVar230;
      auVar42._0_4_ = local_b8._0_4_ * fVar227;
      auVar42._8_4_ = local_b8._8_4_ * fVar231;
      auVar42._12_4_ = local_b8._12_4_ * fVar119;
      auVar42._16_4_ = local_b8._16_4_ * fVar120;
      auVar42._20_4_ = local_b8._20_4_ * fVar121;
      auVar42._24_4_ = local_b8._24_4_ * fVar122;
      auVar42._28_4_ = local_b8._28_4_;
      auVar25 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar245 * fStack_114;
      auVar43._0_4_ = fVar263 * local_118;
      auVar43._8_4_ = fVar264 * fStack_110;
      auVar43._12_4_ = fVar246 * fStack_10c;
      auVar43._16_4_ = fVar265 * fStack_108;
      auVar43._20_4_ = fVar206 * fStack_104;
      auVar43._24_4_ = fVar225 * fStack_100;
      auVar43._28_4_ = auVar201._28_4_;
      auVar44._4_4_ = fVar230 * fStack_f4;
      auVar44._0_4_ = fVar227 * local_f8;
      auVar44._8_4_ = fVar231 * fStack_f0;
      auVar44._12_4_ = fVar119 * fStack_ec;
      auVar44._16_4_ = fVar120 * fStack_e8;
      auVar44._20_4_ = fVar121 * fStack_e4;
      auVar44._24_4_ = fVar122 * fStack_e0;
      auVar44._28_4_ = fVar244;
      auVar27 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar245 * fStack_5c4;
      auVar45._0_4_ = fVar263 * local_5c8;
      auVar45._8_4_ = fVar264 * fStack_5c0;
      auVar45._12_4_ = fVar246 * fStack_5bc;
      auVar45._16_4_ = fVar265 * fStack_5b8;
      auVar45._20_4_ = fVar206 * fStack_5b4;
      auVar45._24_4_ = fVar225 * fStack_5b0;
      auVar45._28_4_ = fVar244;
      auVar46._4_4_ = fVar230 * (float)local_5a8._4_4_;
      auVar46._0_4_ = fVar227 * (float)local_5a8._0_4_;
      auVar46._8_4_ = fVar231 * fStack_5a0;
      auVar46._12_4_ = fVar119 * fStack_59c;
      auVar46._16_4_ = fVar120 * fStack_598;
      auVar46._20_4_ = fVar121 * fStack_594;
      auVar46._24_4_ = fVar122 * fStack_590;
      auVar46._28_4_ = auVar21._28_4_;
      auVar150 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_d8._4_4_ * fVar245;
      auVar47._0_4_ = local_d8._0_4_ * fVar263;
      auVar47._8_4_ = local_d8._8_4_ * fVar264;
      auVar47._12_4_ = local_d8._12_4_ * fVar246;
      auVar47._16_4_ = local_d8._16_4_ * fVar265;
      auVar47._20_4_ = local_d8._20_4_ * fVar206;
      auVar47._24_4_ = local_d8._24_4_ * fVar225;
      auVar47._28_4_ = auVar21._28_4_;
      auVar48._4_4_ = auVar112._4_4_ * fVar230;
      auVar48._0_4_ = auVar112._0_4_ * fVar227;
      auVar48._8_4_ = auVar112._8_4_ * fVar231;
      auVar48._12_4_ = auVar112._12_4_ * fVar119;
      auVar48._16_4_ = auVar112._16_4_ * fVar120;
      auVar48._20_4_ = auVar112._20_4_ * fVar121;
      uVar75 = auVar112._28_4_;
      auVar48._24_4_ = auVar112._24_4_ * fVar122;
      auVar48._28_4_ = uVar75;
      auVar112 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = auVar305._4_4_ * fVar245;
      auVar49._0_4_ = auVar305._0_4_ * fVar263;
      auVar49._8_4_ = auVar305._8_4_ * fVar264;
      auVar49._12_4_ = auVar305._12_4_ * fVar246;
      auVar49._16_4_ = auVar305._16_4_ * fVar265;
      auVar49._20_4_ = auVar305._20_4_ * fVar206;
      auVar49._24_4_ = auVar305._24_4_ * fVar225;
      auVar49._28_4_ = uVar75;
      auVar50._4_4_ = auVar275._4_4_ * fVar230;
      auVar50._0_4_ = auVar275._0_4_ * fVar227;
      auVar50._8_4_ = auVar275._8_4_ * fVar231;
      auVar50._12_4_ = auVar275._12_4_ * fVar119;
      auVar50._16_4_ = auVar275._16_4_ * fVar120;
      auVar50._20_4_ = auVar275._20_4_ * fVar121;
      auVar50._24_4_ = auVar275._24_4_ * fVar122;
      auVar50._28_4_ = auVar275._28_4_;
      auVar223 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar245 * fStack_154;
      auVar51._0_4_ = fVar263 * local_158;
      auVar51._8_4_ = fVar264 * fStack_150;
      auVar51._12_4_ = fVar246 * fStack_14c;
      auVar51._16_4_ = fVar265 * fStack_148;
      auVar51._20_4_ = fVar206 * fStack_144;
      auVar51._24_4_ = fVar225 * fStack_140;
      auVar51._28_4_ = uVar75;
      auVar52._4_4_ = fVar230 * fStack_134;
      auVar52._0_4_ = fVar227 * local_138;
      auVar52._8_4_ = fVar231 * fStack_130;
      auVar52._12_4_ = fVar119 * fStack_12c;
      auVar52._16_4_ = fVar120 * fStack_128;
      auVar52._20_4_ = fVar121 * fStack_124;
      auVar52._24_4_ = fVar122 * fStack_120;
      auVar52._28_4_ = auVar305._28_4_;
      auVar28 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar245 * auVar26._4_4_;
      auVar53._0_4_ = fVar263 * auVar26._0_4_;
      auVar53._8_4_ = fVar264 * auVar26._8_4_;
      auVar53._12_4_ = fVar246 * auVar26._12_4_;
      auVar53._16_4_ = fVar265 * auVar26._16_4_;
      auVar53._20_4_ = fVar206 * auVar26._20_4_;
      auVar53._24_4_ = fVar225 * auVar26._24_4_;
      auVar53._28_4_ = auVar305._28_4_;
      auVar54._4_4_ = fStack_514 * fVar230;
      auVar54._0_4_ = local_518 * fVar227;
      auVar54._8_4_ = fStack_510 * fVar231;
      auVar54._12_4_ = fStack_50c * fVar119;
      auVar54._16_4_ = fStack_508 * fVar120;
      auVar54._20_4_ = fStack_504 * fVar121;
      auVar54._24_4_ = fStack_500 * fVar122;
      auVar54._28_4_ = local_d8._28_4_;
      auVar26 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar245 * auVar114._4_4_;
      auVar55._0_4_ = fVar263 * auVar114._0_4_;
      auVar55._8_4_ = fVar264 * auVar114._8_4_;
      auVar55._12_4_ = fVar246 * auVar114._12_4_;
      auVar55._16_4_ = fVar265 * auVar114._16_4_;
      auVar55._20_4_ = fVar206 * auVar114._20_4_;
      auVar55._24_4_ = fVar225 * auVar114._24_4_;
      auVar55._28_4_ = auVar23._28_4_ + auVar24._28_4_;
      auVar56._4_4_ = auVar113._4_4_ * fVar230;
      auVar56._0_4_ = auVar113._0_4_ * fVar227;
      auVar56._8_4_ = auVar113._8_4_ * fVar231;
      auVar56._12_4_ = auVar113._12_4_ * fVar119;
      auVar56._16_4_ = auVar113._16_4_ * fVar120;
      auVar56._20_4_ = auVar113._20_4_ * fVar121;
      auVar56._24_4_ = auVar113._24_4_ * fVar122;
      auVar56._28_4_ = auVar22._28_4_ + fVar244;
      auVar113 = vsubps_avx(auVar55,auVar56);
      auVar24 = vminps_avx(auVar25,auVar27);
      auVar23 = vmaxps_avx(auVar25,auVar27);
      auVar21 = vminps_avx(auVar150,auVar112);
      auVar21 = vminps_avx(auVar24,auVar21);
      auVar24 = vmaxps_avx(auVar150,auVar112);
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar22 = vminps_avx(auVar223,auVar28);
      auVar24 = vmaxps_avx(auVar223,auVar28);
      auVar112 = vminps_avx(auVar26,auVar113);
      auVar22 = vminps_avx(auVar22,auVar112);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar26,auVar113);
      auVar24 = vmaxps_avx(auVar24,auVar21);
      auVar24 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vcmpps_avx(auVar22,local_78,2);
      auVar24 = vcmpps_avx(auVar24,local_98,5);
      auVar23 = vandps_avx(auVar24,auVar23);
      auVar111 = vandps_avx(local_178,auVar111);
      auVar24 = auVar111 & auVar23;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar111 = vandps_avx(auVar23,auVar111);
        uVar68 = vmovmskps_avx(auVar111);
        if (uVar68 != 0) {
          mask_stack[uVar73] = uVar68 & 0xff;
          BVar5 = (BBox1f)vmovlps_avx(auVar277);
          cu_stack[uVar73] = BVar5;
          BVar5 = (BBox1f)vmovlps_avx(auVar267);
          cv_stack[uVar73] = BVar5;
          uVar73 = (ulong)((int)uVar73 + 1);
        }
      }
    }
LAB_0094bc6c:
    do {
      do {
        do {
          do {
            if ((int)uVar73 == 0) {
              auVar58 = ZEXT812(0) << 0x20;
              if (bVar77) goto LAB_0094cc71;
              uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar110._4_4_ = uVar75;
              auVar110._0_4_ = uVar75;
              auVar110._8_4_ = uVar75;
              auVar110._12_4_ = uVar75;
              auVar163 = vcmpps_avx(auVar251,auVar110,2);
              uVar69 = vmovmskps_avx(auVar163);
              uVar70 = (ulong)((uint)uVar70 & (uint)uVar70 + 0xf & uVar69);
              goto LAB_0094a9a3;
            }
            uVar71 = (int)uVar73 - 1;
            uVar68 = mask_stack[uVar71];
            fVar244 = cu_stack[uVar71].lower;
            fVar263 = cu_stack[uVar71].upper;
            auVar353._8_8_ = 0;
            auVar353._0_4_ = cv_stack[uVar71].lower;
            auVar353._4_4_ = cv_stack[uVar71].upper;
            auVar357 = ZEXT1664(auVar353);
            uVar13 = 0;
            if (uVar68 != 0) {
              for (; (uVar68 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            uVar68 = uVar68 - 1 & uVar68;
            mask_stack[uVar71] = uVar68;
            if (uVar68 == 0) {
              uVar73 = (ulong)uVar71;
            }
            fVar264 = (float)(uVar13 + 1) * 0.14285715;
            fVar245 = (1.0 - (float)uVar13 * 0.14285715) * fVar244 +
                      fVar263 * (float)uVar13 * 0.14285715;
            fVar244 = (1.0 - fVar264) * fVar244 + fVar263 * fVar264;
            fVar263 = fVar244 - fVar245;
            if (0.16666667 <= fVar263) {
              auVar99 = vinsertps_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar244),0x10);
              auVar363 = ZEXT1664(auVar99);
              goto LAB_0094b61b;
            }
            auVar99 = vshufps_avx(auVar353,auVar353,0x50);
            auVar130._8_4_ = 0x3f800000;
            auVar130._0_8_ = 0x3f8000003f800000;
            auVar130._12_4_ = 0x3f800000;
            auVar189 = vsubps_avx(auVar130,auVar99);
            fVar264 = auVar99._0_4_;
            fVar246 = auVar99._4_4_;
            fVar265 = auVar99._8_4_;
            fVar206 = auVar99._12_4_;
            fVar225 = auVar189._0_4_;
            fVar227 = auVar189._4_4_;
            fVar230 = auVar189._8_4_;
            fVar231 = auVar189._12_4_;
            auVar166._0_4_ = auVar287._0_4_ * fVar264 + fVar225 * auVar337._0_4_;
            auVar166._4_4_ = auVar287._4_4_ * fVar246 + fVar227 * auVar337._4_4_;
            auVar166._8_4_ = auVar287._0_4_ * fVar265 + fVar230 * auVar337._0_4_;
            auVar166._12_4_ = auVar287._4_4_ * fVar206 + fVar231 * auVar337._4_4_;
            auVar214._0_4_ = auVar301._0_4_ * fVar264 + auVar348._0_4_ * fVar225;
            auVar214._4_4_ = auVar301._4_4_ * fVar246 + auVar348._4_4_ * fVar227;
            auVar214._8_4_ = auVar301._0_4_ * fVar265 + auVar348._0_4_ * fVar230;
            auVar214._12_4_ = auVar301._4_4_ * fVar206 + auVar348._4_4_ * fVar231;
            auVar236._0_4_ = auVar317._0_4_ * fVar264 + auVar361._0_4_ * fVar225;
            auVar236._4_4_ = auVar317._4_4_ * fVar246 + auVar361._4_4_ * fVar227;
            auVar236._8_4_ = auVar317._0_4_ * fVar265 + auVar361._0_4_ * fVar230;
            auVar236._12_4_ = auVar317._4_4_ * fVar206 + auVar361._4_4_ * fVar231;
            auVar96._0_4_ = auVar94._0_4_ * fVar264 + auVar272._0_4_ * fVar225;
            auVar96._4_4_ = auVar94._4_4_ * fVar246 + auVar272._4_4_ * fVar227;
            auVar96._8_4_ = auVar94._0_4_ * fVar265 + auVar272._0_4_ * fVar230;
            auVar96._12_4_ = auVar94._4_4_ * fVar206 + auVar272._4_4_ * fVar231;
            auVar151._16_16_ = auVar166;
            auVar151._0_16_ = auVar166;
            auVar185._16_16_ = auVar214;
            auVar185._0_16_ = auVar214;
            auVar224._16_16_ = auVar236;
            auVar224._0_16_ = auVar236;
            auVar111 = ZEXT2032(CONCAT416(fVar244,ZEXT416((uint)fVar245)));
            auVar111 = vshufps_avx(auVar111,auVar111,0);
            auVar23 = vsubps_avx(auVar185,auVar151);
            fVar264 = auVar111._0_4_;
            fVar246 = auVar111._4_4_;
            fVar265 = auVar111._8_4_;
            fVar206 = auVar111._12_4_;
            fVar225 = auVar111._16_4_;
            fVar227 = auVar111._20_4_;
            fVar230 = auVar111._24_4_;
            auVar152._0_4_ = auVar166._0_4_ + auVar23._0_4_ * fVar264;
            auVar152._4_4_ = auVar166._4_4_ + auVar23._4_4_ * fVar246;
            auVar152._8_4_ = auVar166._8_4_ + auVar23._8_4_ * fVar265;
            auVar152._12_4_ = auVar166._12_4_ + auVar23._12_4_ * fVar206;
            auVar152._16_4_ = auVar166._0_4_ + auVar23._16_4_ * fVar225;
            auVar152._20_4_ = auVar166._4_4_ + auVar23._20_4_ * fVar227;
            auVar152._24_4_ = auVar166._8_4_ + auVar23._24_4_ * fVar230;
            auVar152._28_4_ = auVar166._12_4_ + auVar23._28_4_;
            auVar111 = vsubps_avx(auVar224,auVar185);
            auVar186._0_4_ = auVar214._0_4_ + auVar111._0_4_ * fVar264;
            auVar186._4_4_ = auVar214._4_4_ + auVar111._4_4_ * fVar246;
            auVar186._8_4_ = auVar214._8_4_ + auVar111._8_4_ * fVar265;
            auVar186._12_4_ = auVar214._12_4_ + auVar111._12_4_ * fVar206;
            auVar186._16_4_ = auVar214._0_4_ + auVar111._16_4_ * fVar225;
            auVar186._20_4_ = auVar214._4_4_ + auVar111._20_4_ * fVar227;
            auVar186._24_4_ = auVar214._8_4_ + auVar111._24_4_ * fVar230;
            auVar186._28_4_ = auVar214._12_4_ + auVar111._28_4_;
            auVar99 = vsubps_avx(auVar96,auVar236);
            auVar115._0_4_ = auVar236._0_4_ + auVar99._0_4_ * fVar264;
            auVar115._4_4_ = auVar236._4_4_ + auVar99._4_4_ * fVar246;
            auVar115._8_4_ = auVar236._8_4_ + auVar99._8_4_ * fVar265;
            auVar115._12_4_ = auVar236._12_4_ + auVar99._12_4_ * fVar206;
            auVar115._16_4_ = auVar236._0_4_ + auVar99._0_4_ * fVar225;
            auVar115._20_4_ = auVar236._4_4_ + auVar99._4_4_ * fVar227;
            auVar115._24_4_ = auVar236._8_4_ + auVar99._8_4_ * fVar230;
            auVar115._28_4_ = auVar236._12_4_ + auVar99._12_4_;
            auVar111 = vsubps_avx(auVar186,auVar152);
            auVar153._0_4_ = auVar152._0_4_ + fVar264 * auVar111._0_4_;
            auVar153._4_4_ = auVar152._4_4_ + fVar246 * auVar111._4_4_;
            auVar153._8_4_ = auVar152._8_4_ + fVar265 * auVar111._8_4_;
            auVar153._12_4_ = auVar152._12_4_ + fVar206 * auVar111._12_4_;
            auVar153._16_4_ = auVar152._16_4_ + fVar225 * auVar111._16_4_;
            auVar153._20_4_ = auVar152._20_4_ + fVar227 * auVar111._20_4_;
            auVar153._24_4_ = auVar152._24_4_ + fVar230 * auVar111._24_4_;
            auVar153._28_4_ = auVar152._28_4_ + auVar111._28_4_;
            auVar111 = vsubps_avx(auVar115,auVar186);
            auVar116._0_4_ = auVar186._0_4_ + fVar264 * auVar111._0_4_;
            auVar116._4_4_ = auVar186._4_4_ + fVar246 * auVar111._4_4_;
            auVar116._8_4_ = auVar186._8_4_ + fVar265 * auVar111._8_4_;
            auVar116._12_4_ = auVar186._12_4_ + fVar206 * auVar111._12_4_;
            auVar116._16_4_ = auVar186._16_4_ + fVar225 * auVar111._16_4_;
            auVar116._20_4_ = auVar186._20_4_ + fVar227 * auVar111._20_4_;
            auVar116._24_4_ = auVar186._24_4_ + fVar230 * auVar111._24_4_;
            auVar116._28_4_ = auVar186._28_4_ + auVar111._28_4_;
            auVar111 = vsubps_avx(auVar116,auVar153);
            auVar258._0_4_ = auVar153._0_4_ + fVar264 * auVar111._0_4_;
            auVar258._4_4_ = auVar153._4_4_ + fVar246 * auVar111._4_4_;
            auVar258._8_4_ = auVar153._8_4_ + fVar265 * auVar111._8_4_;
            auVar258._12_4_ = auVar153._12_4_ + fVar206 * auVar111._12_4_;
            auVar262._16_4_ = auVar153._16_4_ + fVar225 * auVar111._16_4_;
            auVar262._0_16_ = auVar258;
            auVar262._20_4_ = auVar153._20_4_ + fVar227 * auVar111._20_4_;
            auVar262._24_4_ = auVar153._24_4_ + fVar230 * auVar111._24_4_;
            auVar262._28_4_ = auVar153._28_4_ + auVar186._28_4_;
            auVar233 = auVar262._16_16_;
            auVar132 = vshufps_avx(ZEXT416((uint)(fVar263 * 0.33333334)),
                                   ZEXT416((uint)(fVar263 * 0.33333334)),0);
            auVar215._0_4_ = auVar258._0_4_ + auVar132._0_4_ * auVar111._0_4_ * 3.0;
            auVar215._4_4_ = auVar258._4_4_ + auVar132._4_4_ * auVar111._4_4_ * 3.0;
            auVar215._8_4_ = auVar258._8_4_ + auVar132._8_4_ * auVar111._8_4_ * 3.0;
            auVar215._12_4_ = auVar258._12_4_ + auVar132._12_4_ * auVar111._12_4_ * 3.0;
            auVar182 = vshufpd_avx(auVar258,auVar258,3);
            auVar144 = vshufpd_avx(auVar233,auVar233,3);
            auVar99 = vsubps_avx(auVar182,auVar258);
            auVar189 = vsubps_avx(auVar144,auVar233);
            auVar97._0_4_ = auVar99._0_4_ + auVar189._0_4_;
            auVar97._4_4_ = auVar99._4_4_ + auVar189._4_4_;
            auVar97._8_4_ = auVar99._8_4_ + auVar189._8_4_;
            auVar97._12_4_ = auVar99._12_4_ + auVar189._12_4_;
            auVar99 = vmovshdup_avx(auVar258);
            auVar189 = vmovshdup_avx(auVar215);
            auVar168 = vshufps_avx(auVar97,auVar97,0);
            auVar133 = vshufps_avx(auVar97,auVar97,0x55);
            fVar264 = auVar133._0_4_;
            fVar246 = auVar133._4_4_;
            fVar265 = auVar133._8_4_;
            fVar206 = auVar133._12_4_;
            fVar225 = auVar168._0_4_;
            fVar227 = auVar168._4_4_;
            fVar230 = auVar168._8_4_;
            fVar231 = auVar168._12_4_;
            auVar98._0_4_ = fVar225 * auVar258._0_4_ + auVar99._0_4_ * fVar264;
            auVar98._4_4_ = fVar227 * auVar258._4_4_ + auVar99._4_4_ * fVar246;
            auVar98._8_4_ = fVar230 * auVar258._8_4_ + auVar99._8_4_ * fVar265;
            auVar98._12_4_ = fVar231 * auVar258._12_4_ + auVar99._12_4_ * fVar206;
            auVar326._0_4_ = fVar225 * auVar215._0_4_ + auVar189._0_4_ * fVar264;
            auVar326._4_4_ = fVar227 * auVar215._4_4_ + auVar189._4_4_ * fVar246;
            auVar326._8_4_ = fVar230 * auVar215._8_4_ + auVar189._8_4_ * fVar265;
            auVar326._12_4_ = fVar231 * auVar215._12_4_ + auVar189._12_4_ * fVar206;
            auVar189 = vshufps_avx(auVar98,auVar98,0xe8);
            auVar168 = vshufps_avx(auVar326,auVar326,0xe8);
            auVar99 = vcmpps_avx(auVar189,auVar168,1);
            uVar68 = vextractps_avx(auVar99,0);
            auVar133 = auVar326;
            if ((uVar68 & 1) == 0) {
              auVar133 = auVar98;
            }
            auVar131._0_4_ = auVar132._0_4_ * auVar111._16_4_ * 3.0;
            auVar131._4_4_ = auVar132._4_4_ * auVar111._20_4_ * 3.0;
            auVar131._8_4_ = auVar132._8_4_ * auVar111._24_4_ * 3.0;
            auVar131._12_4_ = auVar132._12_4_ * 0.0;
            auVar266 = vsubps_avx(auVar233,auVar131);
            auVar132 = vmovshdup_avx(auVar266);
            auVar233 = vmovshdup_avx(auVar233);
            fVar119 = auVar266._0_4_;
            fVar120 = auVar266._4_4_;
            auVar237._0_4_ = fVar119 * fVar225 + auVar132._0_4_ * fVar264;
            auVar237._4_4_ = fVar120 * fVar227 + auVar132._4_4_ * fVar246;
            auVar237._8_4_ = auVar266._8_4_ * fVar230 + auVar132._8_4_ * fVar265;
            auVar237._12_4_ = auVar266._12_4_ * fVar231 + auVar132._12_4_ * fVar206;
            auVar362._0_4_ = fVar225 * auVar262._16_4_ + auVar233._0_4_ * fVar264;
            auVar362._4_4_ = fVar227 * auVar262._20_4_ + auVar233._4_4_ * fVar246;
            auVar362._8_4_ = fVar230 * auVar262._24_4_ + auVar233._8_4_ * fVar265;
            auVar362._12_4_ = fVar231 * auVar262._28_4_ + auVar233._12_4_ * fVar206;
            auVar233 = vshufps_avx(auVar237,auVar237,0xe8);
            auVar250 = vshufps_avx(auVar362,auVar362,0xe8);
            auVar132 = vcmpps_avx(auVar233,auVar250,1);
            uVar68 = vextractps_avx(auVar132,0);
            auVar267 = auVar362;
            if ((uVar68 & 1) == 0) {
              auVar267 = auVar237;
            }
            auVar133 = vmaxss_avx(auVar267,auVar133);
            auVar189 = vminps_avx(auVar189,auVar168);
            auVar168 = vminps_avx(auVar233,auVar250);
            auVar168 = vminps_avx(auVar189,auVar168);
            auVar99 = vshufps_avx(auVar99,auVar99,0x55);
            auVar99 = vblendps_avx(auVar99,auVar132,2);
            auVar132 = vpslld_avx(auVar99,0x1f);
            auVar99 = vshufpd_avx(auVar326,auVar326,1);
            auVar99 = vinsertps_avx(auVar99,auVar362,0x9c);
            auVar189 = vshufpd_avx(auVar98,auVar98,1);
            auVar189 = vinsertps_avx(auVar189,auVar237,0x9c);
            auVar99 = vblendvps_avx(auVar189,auVar99,auVar132);
            auVar189 = vmovshdup_avx(auVar99);
            auVar99 = vmaxss_avx(auVar189,auVar99);
            fVar265 = auVar168._0_4_;
            auVar189 = vmovshdup_avx(auVar168);
            fVar246 = auVar99._0_4_;
            fVar206 = auVar189._0_4_;
            fVar264 = auVar133._0_4_;
            if ((fVar265 < 0.0001) && (-0.0001 < fVar246)) break;
            if ((fVar206 < 0.0001 && -0.0001 < fVar264) || (fVar265 < 0.0001 && -0.0001 < fVar264))
            break;
            auVar132 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar99,1);
            auVar189 = vcmpps_avx(auVar189,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar189 = vandps_avx(auVar189,auVar132);
          } while ((auVar189 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar132 = vcmpps_avx(auVar168,_DAT_01f45a50,1);
          auVar189 = vcmpss_avx(auVar133,ZEXT416(0) << 0x20,1);
          auVar167._8_4_ = 0x3f800000;
          auVar167._0_8_ = 0x3f8000003f800000;
          auVar167._12_4_ = 0x3f800000;
          auVar216._8_4_ = 0xbf800000;
          auVar216._0_8_ = 0xbf800000bf800000;
          auVar216._12_4_ = 0xbf800000;
          auVar189 = vblendvps_avx(auVar167,auVar216,auVar189);
          auVar132 = vblendvps_avx(auVar167,auVar216,auVar132);
          auVar168 = vcmpss_avx(auVar132,auVar189,4);
          auVar168 = vpshufd_avx(ZEXT416(auVar168._0_4_ & 1),0x50);
          auVar168 = vpslld_avx(auVar168,0x1f);
          auVar168 = vpsrad_avx(auVar168,0x1f);
          auVar168 = vpandn_avx(auVar168,_DAT_01f7afb0);
          auVar133 = vmovshdup_avx(auVar132);
          fVar225 = auVar133._0_4_;
          if ((auVar132._0_4_ != fVar225) || (NAN(auVar132._0_4_) || NAN(fVar225))) {
            if ((fVar206 != fVar265) || (NAN(fVar206) || NAN(fVar265))) {
              fVar265 = -fVar265 / (fVar206 - fVar265);
              auVar132 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar265) * 0.0 + fVar265)));
            }
            else {
              auVar132 = ZEXT816(0x3f80000000000000);
              if ((fVar265 != 0.0) || (NAN(fVar265))) {
                auVar132 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar233 = vcmpps_avx(auVar168,auVar132,1);
            auVar133 = vblendps_avx(auVar168,auVar132,2);
            auVar132 = vblendps_avx(auVar132,auVar168,2);
            auVar168 = vblendvps_avx(auVar132,auVar133,auVar233);
          }
          auVar99 = vcmpss_avx(auVar99,ZEXT416(0) << 0x20,1);
          auVar169._8_4_ = 0x3f800000;
          auVar169._0_8_ = 0x3f8000003f800000;
          auVar169._12_4_ = 0x3f800000;
          auVar217._8_4_ = 0xbf800000;
          auVar217._0_8_ = 0xbf800000bf800000;
          auVar217._12_4_ = 0xbf800000;
          auVar99 = vblendvps_avx(auVar169,auVar217,auVar99);
          fVar265 = auVar99._0_4_;
          if ((auVar189._0_4_ != fVar265) || (NAN(auVar189._0_4_) || NAN(fVar265))) {
            if ((fVar246 != fVar264) || (NAN(fVar246) || NAN(fVar264))) {
              fVar264 = -fVar264 / (fVar246 - fVar264);
              auVar99 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar264) * 0.0 + fVar264)));
            }
            else {
              auVar99 = ZEXT816(0x3f80000000000000);
              if ((fVar264 != 0.0) || (NAN(fVar264))) {
                auVar99 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar132 = vcmpps_avx(auVar168,auVar99,1);
            auVar189 = vblendps_avx(auVar168,auVar99,2);
            auVar99 = vblendps_avx(auVar99,auVar168,2);
            auVar168 = vblendvps_avx(auVar99,auVar189,auVar132);
          }
          if ((fVar225 != fVar265) || (NAN(fVar225) || NAN(fVar265))) {
            auVar100._8_4_ = 0x3f800000;
            auVar100._0_8_ = 0x3f8000003f800000;
            auVar100._12_4_ = 0x3f800000;
            auVar99 = vcmpps_avx(auVar168,auVar100,1);
            auVar189 = vinsertps_avx(auVar168,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar170._4_12_ = auVar168._4_12_;
            auVar170._0_4_ = 0x3f800000;
            auVar168 = vblendvps_avx(auVar170,auVar189,auVar99);
          }
          auVar99 = vcmpps_avx(auVar168,_DAT_01f46740,1);
          auVar59._12_4_ = 0;
          auVar59._0_12_ = auVar168._4_12_;
          auVar189 = vinsertps_avx(auVar168,ZEXT416(0x3f800000),0x10);
          auVar99 = vblendvps_avx(auVar189,auVar59 << 0x20,auVar99);
          auVar189 = vmovshdup_avx(auVar99);
        } while (auVar189._0_4_ < auVar99._0_4_);
        auVar101._0_4_ = auVar99._0_4_ + -0.1;
        auVar101._4_4_ = auVar99._4_4_ + 0.1;
        auVar101._8_4_ = auVar99._8_4_ + 0.0;
        auVar101._12_4_ = auVar99._12_4_ + 0.0;
        auVar132 = vshufpd_avx(auVar215,auVar215,3);
        auVar259._8_8_ = 0x3f80000000000000;
        auVar259._0_8_ = 0x3f80000000000000;
        auVar99 = vcmpps_avx(auVar101,auVar259,1);
        auVar57._12_4_ = 0;
        auVar57._0_12_ = auVar101._4_12_;
        auVar189 = vinsertps_avx(auVar101,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar99 = vblendvps_avx(auVar189,auVar57 << 0x20,auVar99);
        auVar189 = vshufpd_avx(auVar266,auVar266,3);
        auVar168 = vshufps_avx(auVar99,auVar99,0x50);
        auVar260._8_4_ = 0x3f800000;
        auVar260._0_8_ = 0x3f8000003f800000;
        auVar260._12_4_ = 0x3f800000;
        auVar133 = vsubps_avx(auVar260,auVar168);
        local_468 = auVar182._0_4_;
        fStack_464 = auVar182._4_4_;
        fStack_460 = auVar182._8_4_;
        fStack_45c = auVar182._12_4_;
        fVar264 = auVar168._0_4_;
        fVar246 = auVar168._4_4_;
        fVar265 = auVar168._8_4_;
        fVar206 = auVar168._12_4_;
        local_588 = auVar144._0_4_;
        fStack_584 = auVar144._4_4_;
        fStack_580 = auVar144._8_4_;
        fStack_57c = auVar144._12_4_;
        fVar225 = auVar133._0_4_;
        fVar227 = auVar133._4_4_;
        fVar230 = auVar133._8_4_;
        fVar231 = auVar133._12_4_;
        auVar102._0_4_ = fVar264 * local_468 + fVar225 * auVar258._0_4_;
        auVar102._4_4_ = fVar246 * fStack_464 + fVar227 * auVar258._4_4_;
        auVar102._8_4_ = fVar265 * fStack_460 + fVar230 * auVar258._0_4_;
        auVar102._12_4_ = fVar206 * fStack_45c + fVar231 * auVar258._4_4_;
        auVar238._0_4_ = auVar132._0_4_ * fVar264 + fVar225 * auVar215._0_4_;
        auVar238._4_4_ = auVar132._4_4_ * fVar246 + fVar227 * auVar215._4_4_;
        auVar238._8_4_ = auVar132._8_4_ * fVar265 + fVar230 * auVar215._0_4_;
        auVar238._12_4_ = auVar132._12_4_ * fVar206 + fVar231 * auVar215._4_4_;
        auVar274._0_4_ = auVar189._0_4_ * fVar264 + fVar225 * fVar119;
        auVar274._4_4_ = auVar189._4_4_ * fVar246 + fVar227 * fVar120;
        auVar274._8_4_ = auVar189._8_4_ * fVar265 + fVar230 * fVar119;
        auVar274._12_4_ = auVar189._12_4_ * fVar206 + fVar231 * fVar120;
        auVar318._0_4_ = fVar264 * local_588 + fVar225 * auVar262._16_4_;
        auVar318._4_4_ = fVar246 * fStack_584 + fVar227 * auVar262._20_4_;
        auVar318._8_4_ = fVar265 * fStack_580 + fVar230 * auVar262._16_4_;
        auVar318._12_4_ = fVar206 * fStack_57c + fVar231 * auVar262._20_4_;
        auVar144 = vsubps_avx(auVar260,auVar99);
        auVar189 = vmovshdup_avx(auVar353);
        auVar182 = vmovsldup_avx(auVar353);
        auVar261._0_4_ = auVar144._0_4_ * auVar182._0_4_ + auVar99._0_4_ * auVar189._0_4_;
        auVar261._4_4_ = auVar144._4_4_ * auVar182._4_4_ + auVar99._4_4_ * auVar189._4_4_;
        auVar261._8_4_ = auVar144._8_4_ * auVar182._8_4_ + auVar99._8_4_ * auVar189._8_4_;
        auVar261._12_4_ = auVar144._12_4_ * auVar182._12_4_ + auVar99._12_4_ * auVar189._12_4_;
        auVar266 = vmovshdup_avx(auVar261);
        auVar99 = vsubps_avx(auVar238,auVar102);
        auVar171._0_4_ = auVar99._0_4_ * 3.0;
        auVar171._4_4_ = auVar99._4_4_ * 3.0;
        auVar171._8_4_ = auVar99._8_4_ * 3.0;
        auVar171._12_4_ = auVar99._12_4_ * 3.0;
        auVar99 = vsubps_avx(auVar274,auVar238);
        auVar198._0_4_ = auVar99._0_4_ * 3.0;
        auVar198._4_4_ = auVar99._4_4_ * 3.0;
        auVar198._8_4_ = auVar99._8_4_ * 3.0;
        auVar198._12_4_ = auVar99._12_4_ * 3.0;
        auVar99 = vsubps_avx(auVar318,auVar274);
        auVar288._0_4_ = auVar99._0_4_ * 3.0;
        auVar288._4_4_ = auVar99._4_4_ * 3.0;
        auVar288._8_4_ = auVar99._8_4_ * 3.0;
        auVar288._12_4_ = auVar99._12_4_ * 3.0;
        auVar189 = vminps_avx(auVar198,auVar288);
        auVar99 = vmaxps_avx(auVar198,auVar288);
        auVar189 = vminps_avx(auVar171,auVar189);
        auVar99 = vmaxps_avx(auVar171,auVar99);
        auVar182 = vshufpd_avx(auVar189,auVar189,3);
        auVar144 = vshufpd_avx(auVar99,auVar99,3);
        auVar189 = vminps_avx(auVar189,auVar182);
        auVar99 = vmaxps_avx(auVar99,auVar144);
        auVar182 = vshufps_avx(ZEXT416((uint)(1.0 / fVar263)),ZEXT416((uint)(1.0 / fVar263)),0);
        auVar289._0_4_ = auVar182._0_4_ * auVar189._0_4_;
        auVar289._4_4_ = auVar182._4_4_ * auVar189._4_4_;
        auVar289._8_4_ = auVar182._8_4_ * auVar189._8_4_;
        auVar289._12_4_ = auVar182._12_4_ * auVar189._12_4_;
        auVar302._0_4_ = auVar182._0_4_ * auVar99._0_4_;
        auVar302._4_4_ = auVar182._4_4_ * auVar99._4_4_;
        auVar302._8_4_ = auVar182._8_4_ * auVar99._8_4_;
        auVar302._12_4_ = auVar182._12_4_ * auVar99._12_4_;
        auVar133 = ZEXT416((uint)(1.0 / (auVar266._0_4_ - auVar261._0_4_)));
        auVar99 = vshufpd_avx(auVar102,auVar102,3);
        auVar189 = vshufpd_avx(auVar238,auVar238,3);
        auVar182 = vshufpd_avx(auVar274,auVar274,3);
        auVar144 = vshufpd_avx(auVar318,auVar318,3);
        auVar99 = vsubps_avx(auVar99,auVar102);
        auVar132 = vsubps_avx(auVar189,auVar238);
        auVar168 = vsubps_avx(auVar182,auVar274);
        auVar144 = vsubps_avx(auVar144,auVar318);
        auVar189 = vminps_avx(auVar99,auVar132);
        auVar99 = vmaxps_avx(auVar99,auVar132);
        auVar182 = vminps_avx(auVar168,auVar144);
        auVar182 = vminps_avx(auVar189,auVar182);
        auVar189 = vmaxps_avx(auVar168,auVar144);
        auVar99 = vmaxps_avx(auVar99,auVar189);
        auVar189 = vshufps_avx(auVar133,auVar133,0);
        auVar349._0_4_ = auVar189._0_4_ * auVar182._0_4_;
        auVar349._4_4_ = auVar189._4_4_ * auVar182._4_4_;
        auVar349._8_4_ = auVar189._8_4_ * auVar182._8_4_;
        auVar349._12_4_ = auVar189._12_4_ * auVar182._12_4_;
        auVar354._0_4_ = auVar189._0_4_ * auVar99._0_4_;
        auVar354._4_4_ = auVar189._4_4_ * auVar99._4_4_;
        auVar354._8_4_ = auVar189._8_4_ * auVar99._8_4_;
        auVar354._12_4_ = auVar189._12_4_ * auVar99._12_4_;
        auVar99 = vmovsldup_avx(auVar261);
        auVar319._4_12_ = auVar99._4_12_;
        auVar319._0_4_ = fVar245;
        auVar327._4_12_ = auVar261._4_12_;
        auVar327._0_4_ = fVar244;
        auVar199._0_4_ = (fVar245 + fVar244) * 0.5;
        auVar199._4_4_ = (auVar99._4_4_ + auVar261._4_4_) * 0.5;
        auVar199._8_4_ = (auVar99._8_4_ + auVar261._8_4_) * 0.5;
        auVar199._12_4_ = (auVar99._12_4_ + auVar261._12_4_) * 0.5;
        auVar99 = vshufps_avx(auVar199,auVar199,0);
        local_238 = auVar15._0_4_;
        fStack_234 = auVar15._4_4_;
        fStack_230 = auVar15._8_4_;
        fStack_22c = auVar15._12_4_;
        fVar264 = auVar99._0_4_;
        fVar246 = auVar99._4_4_;
        fVar265 = auVar99._8_4_;
        fVar206 = auVar99._12_4_;
        p00.field_0.i[0] = auVar284._0_4_;
        p00.field_0.i[1] = auVar284._4_4_;
        p00.field_0.i[2] = auVar284._8_4_;
        p00.field_0.i[3] = auVar284._12_4_;
        auVar134._0_4_ = fVar264 * local_238 + p00.field_0.v[0];
        auVar134._4_4_ = fVar246 * fStack_234 + p00.field_0.v[1];
        auVar134._8_4_ = fVar265 * fStack_230 + p00.field_0.v[2];
        auVar134._12_4_ = fVar206 * fStack_22c + p00.field_0.v[3];
        local_248 = auVar155._0_4_;
        fStack_244 = auVar155._4_4_;
        fStack_240 = auVar155._8_4_;
        fStack_23c = auVar155._12_4_;
        p01.field_0.i[0] = auVar16._0_4_;
        p01.field_0.i[1] = auVar16._4_4_;
        p01.field_0.i[2] = auVar16._8_4_;
        p01.field_0.i[3] = auVar16._12_4_;
        auVar172._0_4_ = fVar264 * local_248 + p01.field_0.v[0];
        auVar172._4_4_ = fVar246 * fStack_244 + p01.field_0.v[1];
        auVar172._8_4_ = fVar265 * fStack_240 + p01.field_0.v[2];
        auVar172._12_4_ = fVar206 * fStack_23c + p01.field_0.v[3];
        local_258 = auVar82._0_4_;
        fStack_254 = auVar82._4_4_;
        fStack_250 = auVar82._8_4_;
        fStack_24c = auVar82._12_4_;
        p02.field_0.i[0] = auVar162._0_4_;
        p02.field_0.i[1] = auVar162._4_4_;
        p02.field_0.i[2] = auVar162._8_4_;
        p02.field_0.i[3] = auVar162._12_4_;
        auVar239._0_4_ = fVar264 * local_258 + p02.field_0.v[0];
        auVar239._4_4_ = fVar246 * fStack_254 + p02.field_0.v[1];
        auVar239._8_4_ = fVar265 * fStack_250 + p02.field_0.v[2];
        auVar239._12_4_ = fVar206 * fStack_24c + p02.field_0.v[3];
        auVar99 = vsubps_avx(auVar172,auVar134);
        auVar135._0_4_ = auVar134._0_4_ + fVar264 * auVar99._0_4_;
        auVar135._4_4_ = auVar134._4_4_ + fVar246 * auVar99._4_4_;
        auVar135._8_4_ = auVar134._8_4_ + fVar265 * auVar99._8_4_;
        auVar135._12_4_ = auVar134._12_4_ + fVar206 * auVar99._12_4_;
        auVar99 = vsubps_avx(auVar239,auVar172);
        auVar173._0_4_ = auVar172._0_4_ + fVar264 * auVar99._0_4_;
        auVar173._4_4_ = auVar172._4_4_ + fVar246 * auVar99._4_4_;
        auVar173._8_4_ = auVar172._8_4_ + fVar265 * auVar99._8_4_;
        auVar173._12_4_ = auVar172._12_4_ + fVar206 * auVar99._12_4_;
        auVar99 = vsubps_avx(auVar173,auVar135);
        fVar264 = auVar135._0_4_ + fVar264 * auVar99._0_4_;
        fVar246 = auVar135._4_4_ + fVar246 * auVar99._4_4_;
        auVar103._0_8_ = CONCAT44(fVar246,fVar264);
        auVar103._8_4_ = auVar135._8_4_ + fVar265 * auVar99._8_4_;
        auVar103._12_4_ = auVar135._12_4_ + fVar206 * auVar99._12_4_;
        fVar265 = auVar99._0_4_ * 3.0;
        fVar206 = auVar99._4_4_ * 3.0;
        auVar136._0_8_ = CONCAT44(fVar206,fVar265);
        auVar136._8_4_ = auVar99._8_4_ * 3.0;
        auVar136._12_4_ = auVar99._12_4_ * 3.0;
        auVar174._8_8_ = auVar103._0_8_;
        auVar174._0_8_ = auVar103._0_8_;
        auVar99 = vshufpd_avx(auVar103,auVar103,3);
        auVar189 = vshufps_avx(auVar199,auVar199,0x55);
        auVar168 = vsubps_avx(auVar99,auVar174);
        auVar338._0_4_ = auVar168._0_4_ * auVar189._0_4_ + fVar264;
        auVar338._4_4_ = auVar168._4_4_ * auVar189._4_4_ + fVar246;
        auVar338._8_4_ = auVar168._8_4_ * auVar189._8_4_ + fVar264;
        auVar338._12_4_ = auVar168._12_4_ * auVar189._12_4_ + fVar246;
        auVar175._8_8_ = auVar136._0_8_;
        auVar175._0_8_ = auVar136._0_8_;
        auVar99 = vshufpd_avx(auVar136,auVar136,1);
        auVar99 = vsubps_avx(auVar99,auVar175);
        auVar137._0_4_ = auVar99._0_4_ * auVar189._0_4_ + fVar265;
        auVar137._4_4_ = auVar99._4_4_ * auVar189._4_4_ + fVar206;
        auVar137._8_4_ = auVar99._8_4_ * auVar189._8_4_ + fVar265;
        auVar137._12_4_ = auVar99._12_4_ * auVar189._12_4_ + fVar206;
        auVar189 = vmovshdup_avx(auVar137);
        auVar240._0_8_ = auVar189._0_8_ ^ 0x8000000080000000;
        auVar240._8_4_ = auVar189._8_4_ ^ 0x80000000;
        auVar240._12_4_ = auVar189._12_4_ ^ 0x80000000;
        auVar182 = vmovshdup_avx(auVar168);
        auVar99 = vunpcklps_avx(auVar182,auVar240);
        auVar144 = vshufps_avx(auVar99,auVar240,4);
        auVar104._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
        auVar104._8_4_ = -auVar168._8_4_;
        auVar104._12_4_ = -auVar168._12_4_;
        auVar99 = vmovlhps_avx(auVar104,auVar137);
        auVar132 = vshufps_avx(auVar99,auVar137,8);
        auVar99 = ZEXT416((uint)(auVar137._0_4_ * auVar182._0_4_ - auVar168._0_4_ * auVar189._0_4_))
        ;
        auVar189 = vshufps_avx(auVar99,auVar99,0);
        auVar99 = vdivps_avx(auVar144,auVar189);
        auVar189 = vdivps_avx(auVar132,auVar189);
        auVar132 = vinsertps_avx(auVar289,auVar349,0x1c);
        auVar168 = vinsertps_avx(auVar302,auVar354,0x1c);
        auVar133 = vinsertps_avx(auVar349,auVar289,0x4c);
        auVar233 = vinsertps_avx(auVar354,auVar302,0x4c);
        auVar182 = vmovsldup_avx(auVar99);
        auVar176._0_4_ = auVar182._0_4_ * auVar132._0_4_;
        auVar176._4_4_ = auVar182._4_4_ * auVar132._4_4_;
        auVar176._8_4_ = auVar182._8_4_ * auVar132._8_4_;
        auVar176._12_4_ = auVar182._12_4_ * auVar132._12_4_;
        auVar138._0_4_ = auVar168._0_4_ * auVar182._0_4_;
        auVar138._4_4_ = auVar168._4_4_ * auVar182._4_4_;
        auVar138._8_4_ = auVar168._8_4_ * auVar182._8_4_;
        auVar138._12_4_ = auVar168._12_4_ * auVar182._12_4_;
        auVar144 = vminps_avx(auVar176,auVar138);
        auVar182 = vmaxps_avx(auVar138,auVar176);
        auVar250 = vmovsldup_avx(auVar189);
        auVar355._0_4_ = auVar133._0_4_ * auVar250._0_4_;
        auVar355._4_4_ = auVar133._4_4_ * auVar250._4_4_;
        auVar355._8_4_ = auVar133._8_4_ * auVar250._8_4_;
        auVar355._12_4_ = auVar133._12_4_ * auVar250._12_4_;
        auVar177._0_4_ = auVar233._0_4_ * auVar250._0_4_;
        auVar177._4_4_ = auVar233._4_4_ * auVar250._4_4_;
        auVar177._8_4_ = auVar233._8_4_ * auVar250._8_4_;
        auVar177._12_4_ = auVar233._12_4_ * auVar250._12_4_;
        auVar250 = vminps_avx(auVar355,auVar177);
        auVar218._0_4_ = auVar144._0_4_ + auVar250._0_4_;
        auVar218._4_4_ = auVar144._4_4_ + auVar250._4_4_;
        auVar218._8_4_ = auVar144._8_4_ + auVar250._8_4_;
        auVar218._12_4_ = auVar144._12_4_ + auVar250._12_4_;
        auVar144 = vmaxps_avx(auVar177,auVar355);
        auVar250 = vsubps_avx(auVar319,auVar199);
        auVar267 = vsubps_avx(auVar327,auVar199);
        auVar139._0_4_ = auVar182._0_4_ + auVar144._0_4_;
        auVar139._4_4_ = auVar182._4_4_ + auVar144._4_4_;
        auVar139._8_4_ = auVar182._8_4_ + auVar144._8_4_;
        auVar139._12_4_ = auVar182._12_4_ + auVar144._12_4_;
        auVar178._8_8_ = 0x3f800000;
        auVar178._0_8_ = 0x3f800000;
        auVar182 = vsubps_avx(auVar178,auVar139);
        auVar144 = vsubps_avx(auVar178,auVar218);
        fVar230 = auVar250._0_4_;
        auVar219._0_4_ = fVar230 * auVar182._0_4_;
        fVar231 = auVar250._4_4_;
        auVar219._4_4_ = fVar231 * auVar182._4_4_;
        fVar119 = auVar250._8_4_;
        auVar219._8_4_ = fVar119 * auVar182._8_4_;
        fVar120 = auVar250._12_4_;
        auVar219._12_4_ = fVar120 * auVar182._12_4_;
        fVar265 = auVar267._0_4_;
        auVar140._0_4_ = fVar265 * auVar182._0_4_;
        fVar206 = auVar267._4_4_;
        auVar140._4_4_ = fVar206 * auVar182._4_4_;
        fVar225 = auVar267._8_4_;
        auVar140._8_4_ = fVar225 * auVar182._8_4_;
        fVar227 = auVar267._12_4_;
        auVar140._12_4_ = fVar227 * auVar182._12_4_;
        auVar320._0_4_ = fVar230 * auVar144._0_4_;
        auVar320._4_4_ = fVar231 * auVar144._4_4_;
        auVar320._8_4_ = fVar119 * auVar144._8_4_;
        auVar320._12_4_ = fVar120 * auVar144._12_4_;
        auVar179._0_4_ = fVar265 * auVar144._0_4_;
        auVar179._4_4_ = fVar206 * auVar144._4_4_;
        auVar179._8_4_ = fVar225 * auVar144._8_4_;
        auVar179._12_4_ = fVar227 * auVar144._12_4_;
        auVar182 = vminps_avx(auVar219,auVar320);
        auVar144 = vminps_avx(auVar140,auVar179);
        auVar250 = vminps_avx(auVar182,auVar144);
        auVar182 = vmaxps_avx(auVar320,auVar219);
        auVar144 = vmaxps_avx(auVar179,auVar140);
        auVar267 = vshufps_avx(auVar199,auVar199,0x54);
        auVar144 = vmaxps_avx(auVar144,auVar182);
        auVar277 = vshufps_avx(auVar338,auVar338,0);
        auVar278 = vshufps_avx(auVar338,auVar338,0x55);
        auVar182 = vhaddps_avx(auVar250,auVar250);
        auVar144 = vhaddps_avx(auVar144,auVar144);
        auVar200._0_4_ = auVar277._0_4_ * auVar99._0_4_ + auVar278._0_4_ * auVar189._0_4_;
        auVar200._4_4_ = auVar277._4_4_ * auVar99._4_4_ + auVar278._4_4_ * auVar189._4_4_;
        auVar200._8_4_ = auVar277._8_4_ * auVar99._8_4_ + auVar278._8_4_ * auVar189._8_4_;
        auVar200._12_4_ = auVar277._12_4_ * auVar99._12_4_ + auVar278._12_4_ * auVar189._12_4_;
        auVar250 = vsubps_avx(auVar267,auVar200);
        fVar264 = auVar250._0_4_ + auVar182._0_4_;
        fVar246 = auVar250._0_4_ + auVar144._0_4_;
        auVar182 = vmaxss_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar264));
        auVar144 = vminss_avx(ZEXT416((uint)fVar246),ZEXT416((uint)fVar244));
      } while (auVar144._0_4_ < auVar182._0_4_);
      auVar182 = vmovshdup_avx(auVar99);
      auVar105._0_4_ = auVar182._0_4_ * auVar132._0_4_;
      auVar105._4_4_ = auVar182._4_4_ * auVar132._4_4_;
      auVar105._8_4_ = auVar182._8_4_ * auVar132._8_4_;
      auVar105._12_4_ = auVar182._12_4_ * auVar132._12_4_;
      auVar141._0_4_ = auVar168._0_4_ * auVar182._0_4_;
      auVar141._4_4_ = auVar168._4_4_ * auVar182._4_4_;
      auVar141._8_4_ = auVar168._8_4_ * auVar182._8_4_;
      auVar141._12_4_ = auVar168._12_4_ * auVar182._12_4_;
      auVar144 = vminps_avx(auVar105,auVar141);
      auVar182 = vmaxps_avx(auVar141,auVar105);
      auVar132 = vmovshdup_avx(auVar189);
      auVar220._0_4_ = auVar133._0_4_ * auVar132._0_4_;
      auVar220._4_4_ = auVar133._4_4_ * auVar132._4_4_;
      auVar220._8_4_ = auVar133._8_4_ * auVar132._8_4_;
      auVar220._12_4_ = auVar133._12_4_ * auVar132._12_4_;
      auVar142._0_4_ = auVar233._0_4_ * auVar132._0_4_;
      auVar142._4_4_ = auVar233._4_4_ * auVar132._4_4_;
      auVar142._8_4_ = auVar233._8_4_ * auVar132._8_4_;
      auVar142._12_4_ = auVar233._12_4_ * auVar132._12_4_;
      auVar132 = vminps_avx(auVar220,auVar142);
      auVar180._0_4_ = auVar144._0_4_ + auVar132._0_4_;
      auVar180._4_4_ = auVar144._4_4_ + auVar132._4_4_;
      auVar180._8_4_ = auVar144._8_4_ + auVar132._8_4_;
      auVar180._12_4_ = auVar144._12_4_ + auVar132._12_4_;
      auVar144 = vmaxps_avx(auVar142,auVar220);
      auVar106._0_4_ = auVar182._0_4_ + auVar144._0_4_;
      auVar106._4_4_ = auVar182._4_4_ + auVar144._4_4_;
      auVar106._8_4_ = auVar182._8_4_ + auVar144._8_4_;
      auVar106._12_4_ = auVar182._12_4_ + auVar144._12_4_;
      auVar182 = vsubps_avx(auVar259,auVar106);
      auVar144 = vsubps_avx(auVar259,auVar180);
      auVar181._0_4_ = fVar230 * auVar182._0_4_;
      auVar181._4_4_ = fVar231 * auVar182._4_4_;
      auVar181._8_4_ = fVar119 * auVar182._8_4_;
      auVar181._12_4_ = fVar120 * auVar182._12_4_;
      auVar221._0_4_ = fVar230 * auVar144._0_4_;
      auVar221._4_4_ = fVar231 * auVar144._4_4_;
      auVar221._8_4_ = fVar119 * auVar144._8_4_;
      auVar221._12_4_ = fVar120 * auVar144._12_4_;
      auVar107._0_4_ = fVar265 * auVar182._0_4_;
      auVar107._4_4_ = fVar206 * auVar182._4_4_;
      auVar107._8_4_ = fVar225 * auVar182._8_4_;
      auVar107._12_4_ = fVar227 * auVar182._12_4_;
      auVar143._0_4_ = fVar265 * auVar144._0_4_;
      auVar143._4_4_ = fVar206 * auVar144._4_4_;
      auVar143._8_4_ = fVar225 * auVar144._8_4_;
      auVar143._12_4_ = fVar227 * auVar144._12_4_;
      auVar182 = vminps_avx(auVar181,auVar221);
      auVar144 = vminps_avx(auVar107,auVar143);
      auVar182 = vminps_avx(auVar182,auVar144);
      auVar144 = vmaxps_avx(auVar221,auVar181);
      auVar132 = vmaxps_avx(auVar143,auVar107);
      auVar182 = vhaddps_avx(auVar182,auVar182);
      auVar144 = vmaxps_avx(auVar132,auVar144);
      auVar144 = vhaddps_avx(auVar144,auVar144);
      auVar132 = vmovshdup_avx(auVar250);
      auVar168 = ZEXT416((uint)(auVar132._0_4_ + auVar182._0_4_));
      auVar182 = vmaxss_avx(auVar261,auVar168);
      auVar132 = ZEXT416((uint)(auVar132._0_4_ + auVar144._0_4_));
      auVar144 = vminss_avx(auVar132,auVar266);
    } while (auVar144._0_4_ < auVar182._0_4_);
    bVar74 = 0;
    if ((fVar245 < fVar264) && (fVar246 < fVar244)) {
      auVar182 = vcmpps_avx(auVar132,auVar266,1);
      auVar144 = vcmpps_avx(auVar261,auVar168,1);
      auVar182 = vandps_avx(auVar144,auVar182);
      bVar74 = auVar182[0];
    }
    auVar290._8_4_ = 0x7fffffff;
    auVar290._0_8_ = 0x7fffffff7fffffff;
    auVar290._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar14._0_4_;
    p03.field_0.i[1] = auVar14._4_4_;
    p03.field_0.i[2] = auVar14._8_4_;
    p03.field_0.i[3] = auVar14._12_4_;
    if ((3 < (uint)uVar73 || fVar263 < 0.001) || (bVar74 & 1) != 0) {
      lVar72 = 0xc9;
      do {
        lVar72 = lVar72 + -1;
        if (lVar72 == 0) goto LAB_0094bc6c;
        fVar263 = auVar250._0_4_;
        fVar244 = 1.0 - fVar263;
        auVar182 = ZEXT416((uint)(fVar244 * fVar244 * fVar244));
        auVar182 = vshufps_avx(auVar182,auVar182,0);
        auVar144 = ZEXT416((uint)(fVar263 * 3.0 * fVar244 * fVar244));
        auVar144 = vshufps_avx(auVar144,auVar144,0);
        auVar132 = ZEXT416((uint)(fVar244 * fVar263 * fVar263 * 3.0));
        auVar132 = vshufps_avx(auVar132,auVar132,0);
        auVar168 = ZEXT416((uint)(fVar263 * fVar263 * fVar263));
        auVar168 = vshufps_avx(auVar168,auVar168,0);
        fVar244 = p00.field_0.v[0] * auVar182._0_4_ +
                  p01.field_0.v[0] * auVar144._0_4_ +
                  p03.field_0.v[0] * auVar168._0_4_ + p02.field_0.v[0] * auVar132._0_4_;
        fVar263 = p00.field_0.v[1] * auVar182._4_4_ +
                  p01.field_0.v[1] * auVar144._4_4_ +
                  p03.field_0.v[1] * auVar168._4_4_ + p02.field_0.v[1] * auVar132._4_4_;
        auVar108._0_8_ = CONCAT44(fVar263,fVar244);
        auVar108._8_4_ =
             p00.field_0.v[2] * auVar182._8_4_ +
             p01.field_0.v[2] * auVar144._8_4_ +
             p03.field_0.v[2] * auVar168._8_4_ + p02.field_0.v[2] * auVar132._8_4_;
        auVar108._12_4_ =
             p00.field_0.v[3] * auVar182._12_4_ +
             p01.field_0.v[3] * auVar144._12_4_ +
             p03.field_0.v[3] * auVar168._12_4_ + p02.field_0.v[3] * auVar132._12_4_;
        auVar145._8_8_ = auVar108._0_8_;
        auVar145._0_8_ = auVar108._0_8_;
        auVar144 = vshufpd_avx(auVar108,auVar108,1);
        auVar182 = vmovshdup_avx(auVar250);
        auVar144 = vsubps_avx(auVar144,auVar145);
        auVar109._0_4_ = auVar182._0_4_ * auVar144._0_4_ + fVar244;
        auVar109._4_4_ = auVar182._4_4_ * auVar144._4_4_ + fVar263;
        auVar109._8_4_ = auVar182._8_4_ * auVar144._8_4_ + fVar244;
        auVar109._12_4_ = auVar182._12_4_ * auVar144._12_4_ + fVar263;
        auVar182 = vshufps_avx(auVar109,auVar109,0);
        auVar144 = vshufps_avx(auVar109,auVar109,0x55);
        auVar146._0_4_ = auVar99._0_4_ * auVar182._0_4_ + auVar189._0_4_ * auVar144._0_4_;
        auVar146._4_4_ = auVar99._4_4_ * auVar182._4_4_ + auVar189._4_4_ * auVar144._4_4_;
        auVar146._8_4_ = auVar99._8_4_ * auVar182._8_4_ + auVar189._8_4_ * auVar144._8_4_;
        auVar146._12_4_ = auVar99._12_4_ * auVar182._12_4_ + auVar189._12_4_ * auVar144._12_4_;
        auVar250 = vsubps_avx(auVar250,auVar146);
        auVar182 = vandps_avx(auVar290,auVar109);
        auVar144 = vshufps_avx(auVar182,auVar182,0xf5);
        auVar182 = vmaxss_avx(auVar144,auVar182);
      } while (fVar248 <= auVar182._0_4_);
      fVar244 = auVar250._0_4_;
      if ((0.0 <= fVar244) && (fVar244 <= 1.0)) {
        auVar99 = vmovshdup_avx(auVar250);
        fVar263 = auVar99._0_4_;
        if ((0.0 <= fVar263) && (fVar263 <= 1.0)) {
          auVar99 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar233 = vinsertps_avx(auVar99,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28)
          ;
          auVar99 = vdpps_avx(auVar233,auVar18,0x7f);
          auVar189 = vdpps_avx(auVar233,auVar19,0x7f);
          auVar182 = vdpps_avx(auVar233,auVar20,0x7f);
          auVar144 = vdpps_avx(auVar233,auVar83,0x7f);
          auVar132 = vdpps_avx(auVar233,auVar84,0x7f);
          auVar168 = vdpps_avx(auVar233,auVar124,0x7f);
          fVar206 = 1.0 - fVar263;
          auVar133 = vdpps_avx(auVar233,auVar269,0x7f);
          auVar233 = vdpps_avx(auVar233,auVar17,0x7f);
          fVar225 = 1.0 - fVar244;
          fVar245 = auVar250._4_4_;
          fVar264 = auVar250._8_4_;
          fVar246 = auVar250._12_4_;
          fVar265 = fVar225 * fVar244 * fVar244 * 3.0;
          auVar241._0_4_ = fVar244 * fVar244 * fVar244;
          auVar241._4_4_ = fVar245 * fVar245 * fVar245;
          auVar241._8_4_ = fVar264 * fVar264 * fVar264;
          auVar241._12_4_ = fVar246 * fVar246 * fVar246;
          fVar245 = fVar244 * 3.0 * fVar225 * fVar225;
          fVar264 = fVar225 * fVar225 * fVar225;
          fVar244 = (fVar206 * auVar99._0_4_ + fVar263 * auVar182._0_4_) * fVar264 +
                    (fVar206 * auVar189._0_4_ + fVar263 * auVar144._0_4_) * fVar245 +
                    fVar265 * (fVar206 * auVar133._0_4_ + fVar263 * auVar132._0_4_) +
                    auVar241._0_4_ * (auVar168._0_4_ * fVar263 + fVar206 * auVar233._0_4_);
          if ((fVar232 <= fVar244) && (fVar263 = *(float *)(ray + k * 4 + 0x80), fVar244 <= fVar263)
             ) {
            pGVar7 = (context->scene->geometries).items[uVar69].ptr;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar78 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar78 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_1c8 = vshufps_avx(auVar250,auVar250,0x55);
              auVar291._8_4_ = 0x3f800000;
              auVar291._0_8_ = 0x3f8000003f800000;
              auVar291._12_4_ = 0x3f800000;
              auVar99 = vsubps_avx(auVar291,local_1c8);
              fVar246 = local_1c8._0_4_;
              fVar206 = local_1c8._4_4_;
              fVar227 = local_1c8._8_4_;
              fVar230 = local_1c8._12_4_;
              fVar231 = auVar99._0_4_;
              fVar119 = auVar99._4_4_;
              fVar120 = auVar99._8_4_;
              fVar121 = auVar99._12_4_;
              auVar303._0_4_ = fVar246 * (float)local_408._0_4_ + fVar231 * (float)local_3e8._0_4_;
              auVar303._4_4_ = fVar206 * (float)local_408._4_4_ + fVar119 * (float)local_3e8._4_4_;
              auVar303._8_4_ = fVar227 * fStack_400 + fVar120 * fStack_3e0;
              auVar303._12_4_ = fVar230 * fStack_3fc + fVar121 * fStack_3dc;
              auVar321._0_4_ = fVar246 * (float)local_418._0_4_ + fVar231 * fVar79;
              auVar321._4_4_ = fVar206 * (float)local_418._4_4_ + fVar119 * fVar117;
              auVar321._8_4_ = fVar227 * fStack_410 + fVar120 * fVar202;
              auVar321._12_4_ = fVar230 * fStack_40c + fVar121 * fVar207;
              auVar328._0_4_ = fVar246 * local_428 + fVar231 * (float)local_3f8._0_4_;
              auVar328._4_4_ = fVar206 * fStack_424 + fVar119 * (float)local_3f8._4_4_;
              auVar328._8_4_ = fVar227 * fStack_420 + fVar120 * fStack_3f0;
              auVar328._12_4_ = fVar230 * fStack_41c + fVar121 * fStack_3ec;
              auVar292._0_4_ = fVar246 * fVar81 + fVar231 * fVar80;
              auVar292._4_4_ = fVar206 * fVar187 + fVar119 * fVar118;
              auVar292._8_4_ = fVar227 * fVar204 + fVar120 * fVar203;
              auVar292._12_4_ = fVar230 * fVar228 + fVar121 * fVar226;
              auVar144 = vsubps_avx(auVar321,auVar303);
              auVar132 = vsubps_avx(auVar328,auVar321);
              auVar168 = vsubps_avx(auVar292,auVar328);
              local_1d8 = vshufps_avx(auVar250,auVar250,0);
              fVar246 = local_1d8._0_4_;
              fVar227 = local_1d8._4_4_;
              fVar230 = local_1d8._8_4_;
              fVar119 = local_1d8._12_4_;
              auVar99 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
              fVar206 = auVar99._0_4_;
              fVar225 = auVar99._4_4_;
              fVar231 = auVar99._8_4_;
              fVar120 = auVar99._12_4_;
              auVar99 = vshufps_avx(auVar241,auVar241,0);
              local_378 = auVar188._0_4_;
              fStack_374 = auVar188._4_4_;
              fStack_370 = auVar188._8_4_;
              fStack_36c = auVar188._12_4_;
              auVar189 = vshufps_avx(ZEXT416((uint)fVar265),ZEXT416((uint)fVar265),0);
              local_368 = auVar156._0_4_;
              fStack_364 = auVar156._4_4_;
              fStack_360 = auVar156._8_4_;
              fStack_35c = auVar156._12_4_;
              auVar182 = vshufps_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),0);
              local_358 = auVar154._0_4_;
              fStack_354 = auVar154._4_4_;
              fStack_350 = auVar154._8_4_;
              fStack_34c = auVar154._12_4_;
              auVar222._0_4_ =
                   ((auVar132._0_4_ * fVar206 + auVar168._0_4_ * fVar246) * fVar246 +
                   (auVar144._0_4_ * fVar206 + auVar132._0_4_ * fVar246) * fVar206) * 3.0;
              auVar222._4_4_ =
                   ((auVar132._4_4_ * fVar225 + auVar168._4_4_ * fVar227) * fVar227 +
                   (auVar144._4_4_ * fVar225 + auVar132._4_4_ * fVar227) * fVar225) * 3.0;
              auVar222._8_4_ =
                   ((auVar132._8_4_ * fVar231 + auVar168._8_4_ * fVar230) * fVar230 +
                   (auVar144._8_4_ * fVar231 + auVar132._8_4_ * fVar230) * fVar231) * 3.0;
              auVar222._12_4_ =
                   ((auVar132._12_4_ * fVar120 + auVar168._12_4_ * fVar119) * fVar119 +
                   (auVar144._12_4_ * fVar120 + auVar132._12_4_ * fVar119) * fVar120) * 3.0;
              auVar144 = vshufps_avx(ZEXT416((uint)fVar264),ZEXT416((uint)fVar264),0);
              local_348 = auVar123._0_4_;
              fStack_344 = auVar123._4_4_;
              fStack_340 = auVar123._8_4_;
              fStack_33c = auVar123._12_4_;
              auVar147._0_4_ =
                   auVar144._0_4_ * local_348 +
                   auVar182._0_4_ * local_358 +
                   auVar99._0_4_ * local_378 + auVar189._0_4_ * local_368;
              auVar147._4_4_ =
                   auVar144._4_4_ * fStack_344 +
                   auVar182._4_4_ * fStack_354 +
                   auVar99._4_4_ * fStack_374 + auVar189._4_4_ * fStack_364;
              auVar147._8_4_ =
                   auVar144._8_4_ * fStack_340 +
                   auVar182._8_4_ * fStack_350 +
                   auVar99._8_4_ * fStack_370 + auVar189._8_4_ * fStack_360;
              auVar147._12_4_ =
                   auVar144._12_4_ * fStack_33c +
                   auVar182._12_4_ * fStack_34c +
                   auVar99._12_4_ * fStack_36c + auVar189._12_4_ * fStack_35c;
              auVar99 = vshufps_avx(auVar222,auVar222,0xc9);
              auVar183._0_4_ = auVar147._0_4_ * auVar99._0_4_;
              auVar183._4_4_ = auVar147._4_4_ * auVar99._4_4_;
              auVar183._8_4_ = auVar147._8_4_ * auVar99._8_4_;
              auVar183._12_4_ = auVar147._12_4_ * auVar99._12_4_;
              auVar99 = vshufps_avx(auVar147,auVar147,0xc9);
              auVar148._0_4_ = auVar222._0_4_ * auVar99._0_4_;
              auVar148._4_4_ = auVar222._4_4_ * auVar99._4_4_;
              auVar148._8_4_ = auVar222._8_4_ * auVar99._8_4_;
              auVar148._12_4_ = auVar222._12_4_ * auVar99._12_4_;
              auVar189 = vsubps_avx(auVar148,auVar183);
              auVar99 = vshufps_avx(auVar189,auVar189,0x55);
              local_208[0] = (RTCHitN)auVar99[0];
              local_208[1] = (RTCHitN)auVar99[1];
              local_208[2] = (RTCHitN)auVar99[2];
              local_208[3] = (RTCHitN)auVar99[3];
              local_208[4] = (RTCHitN)auVar99[4];
              local_208[5] = (RTCHitN)auVar99[5];
              local_208[6] = (RTCHitN)auVar99[6];
              local_208[7] = (RTCHitN)auVar99[7];
              local_208[8] = (RTCHitN)auVar99[8];
              local_208[9] = (RTCHitN)auVar99[9];
              local_208[10] = (RTCHitN)auVar99[10];
              local_208[0xb] = (RTCHitN)auVar99[0xb];
              local_208[0xc] = (RTCHitN)auVar99[0xc];
              local_208[0xd] = (RTCHitN)auVar99[0xd];
              local_208[0xe] = (RTCHitN)auVar99[0xe];
              local_208[0xf] = (RTCHitN)auVar99[0xf];
              local_1f8 = vshufps_avx(auVar189,auVar189,0xaa);
              local_1e8 = vshufps_avx(auVar189,auVar189,0);
              local_338 = auVar212._0_8_;
              uStack_330 = auVar212._8_8_;
              local_1b8 = local_338;
              uStack_1b0 = uStack_330;
              local_1a8 = auVar163;
              vcmpps_avx(ZEXT1632(auVar163),ZEXT1632(auVar163),0xf);
              uStack_194 = context->user->instID[0];
              local_198 = uStack_194;
              uStack_190 = uStack_194;
              uStack_18c = uStack_194;
              uStack_188 = context->user->instPrimID[0];
              uStack_184 = uStack_188;
              uStack_180 = uStack_188;
              uStack_17c = uStack_188;
              *(float *)(ray + k * 4 + 0x80) = fVar244;
              local_448 = *local_438;
              args.valid = (int *)local_448;
              args.geometryUserPtr = pGVar7->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)ray;
              args.hit = local_208;
              args.N = 4;
              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar7->occlusionFilterN)(&args);
              }
              if (local_448 == (undefined1  [16])0x0) {
                auVar99 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar99 = auVar99 ^ _DAT_01f46b70;
              }
              else {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var12)(&args);
                }
                auVar189 = vpcmpeqd_avx(local_448,_DAT_01f45a50);
                auVar99 = auVar189 ^ _DAT_01f46b70;
                auVar184._8_4_ = 0xff800000;
                auVar184._0_8_ = 0xff800000ff800000;
                auVar184._12_4_ = 0xff800000;
                auVar189 = vblendvps_avx(auVar184,*(undefined1 (*) [16])(args.ray + 0x80),auVar189);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar189;
              }
              auVar149._8_8_ = 0x100000001;
              auVar149._0_8_ = 0x100000001;
              bVar78 = (auVar149 & auVar99) != (undefined1  [16])0x0;
              if (!bVar78) {
                *(float *)(ray + k * 4 + 0x80) = fVar263;
              }
            }
            bVar77 = (bool)(bVar77 | bVar78);
          }
        }
      }
      goto LAB_0094bc6c;
    }
    auVar99 = vinsertps_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar244),0x10);
    auVar363 = ZEXT1664(auVar99);
    auVar357 = ZEXT1664(auVar261);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }